

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar104;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  int iVar37;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar102;
  int iVar103;
  int iVar105;
  int iVar106;
  int iVar107;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar108;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined4 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vfloat4 a0_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  vfloat4 a0_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  vfloat4 a0;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  vfloat4 b0;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  __m128 a_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar147;
  __m128 a;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  float fVar157;
  float fVar165;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar166;
  float fVar182;
  float fVar183;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar184;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  vfloat4 a0_3;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar210;
  float fVar211;
  vfloat4 b0_2;
  undefined1 auVar202 [16];
  float fVar212;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_4;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  RTCFilterFunctionNArguments local_480;
  uint auStack_450 [4];
  undefined1 local_440 [32];
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar27;
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  float fVar129;
  float fVar135;
  float fVar136;
  float fVar146;
  float fVar148;
  float fVar156;
  undefined1 auVar236 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar80 = vpmovsxbd_avx2(auVar40);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar78 = vpmovsxbd_avx2(auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar81 = vpmovsxbd_avx2(auVar39);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar26 * 0xf + 6);
  auVar70 = vpmovsxbd_avx2(auVar51);
  lVar29 = uVar26 * 0x25;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar71 = vpmovsxbd_avx2(auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar26 * 0x11 + 6);
  auVar79 = vpmovsxbd_avx2(auVar55);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar26 * 0x1a + 6);
  auVar72 = vpmovsxbd_avx2(auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar26 * 0x1b + 6);
  auVar65 = vpmovsxbd_avx512vl(auVar53);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar26 * 0x1c + 6);
  auVar66 = vpmovsxbd_avx512vl(auVar57);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar29 + 0x12)));
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar39 = vsubps_avx512vl(auVar40,*(undefined1 (*) [16])(prim + lVar29 + 6));
  fVar147 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0xb + 6));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0xd + 6));
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x12 + 6));
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x16 + 6));
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x14 + 6));
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x18 + 6));
  auVar40 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar40 = vinsertps_avx512f(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar39 = vmulps_avx512vl(auVar38,auVar39);
  auVar40 = vmulps_avx512vl(auVar38,auVar40);
  auVar67 = vcvtdq2ps_avx512vl(auVar80);
  auVar68 = vcvtdq2ps_avx512vl(auVar78);
  auVar69 = vcvtdq2ps_avx512vl(auVar81);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar80 = vcvtdq2ps_avx(auVar79);
  auVar81 = vcvtdq2ps_avx(auVar72);
  auVar72 = vcvtdq2ps_avx512vl(auVar65);
  auVar65 = vcvtdq2ps_avx512vl(auVar66);
  auVar66 = vbroadcastss_avx512vl(auVar40);
  auVar73 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar74 = vpermps_avx512vl(auVar73,ZEXT1632(auVar40));
  auVar75 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar76 = vpermps_avx512vl(auVar75,ZEXT1632(auVar40));
  auVar77 = vmulps_avx512vl(auVar76,auVar69);
  auVar79._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar79._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar79._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar79._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar79._16_4_ = auVar76._16_4_ * auVar80._16_4_;
  auVar79._20_4_ = auVar76._20_4_ * auVar80._20_4_;
  auVar79._24_4_ = auVar76._24_4_ * auVar80._24_4_;
  auVar79._28_4_ = auVar78._28_4_;
  auVar78 = vmulps_avx512vl(auVar76,auVar65);
  auVar76 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar68);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar71);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar72,auVar74);
  auVar74 = vfmadd231ps_avx512vl(auVar76,auVar66,auVar67);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar66,auVar70);
  auVar40 = vfmadd231ps_fma(auVar78,auVar81,auVar66);
  auVar78 = vbroadcastss_avx512vl(auVar39);
  auVar66 = vpermps_avx512vl(auVar73,ZEXT1632(auVar39));
  auVar73 = vpermps_avx512vl(auVar75,ZEXT1632(auVar39));
  auVar69 = vmulps_avx512vl(auVar73,auVar69);
  auVar80 = vmulps_avx512vl(auVar73,auVar80);
  auVar65 = vmulps_avx512vl(auVar73,auVar65);
  auVar68 = vfmadd231ps_avx512vl(auVar69,auVar66,auVar68);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar66,auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar72);
  auVar65 = vfmadd231ps_avx512vl(auVar68,auVar78,auVar67);
  auVar70 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar70);
  auVar78 = vfmadd231ps_avx512vl(auVar71,auVar78,auVar81);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar73._16_4_ = 0x7fffffff;
  auVar73._20_4_ = 0x7fffffff;
  auVar73._24_4_ = 0x7fffffff;
  auVar73._28_4_ = 0x7fffffff;
  auVar80 = vandps_avx(auVar73,auVar74);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
  uVar32 = vcmpps_avx512vl(auVar80,auVar81,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  iVar37 = auVar81._0_4_;
  auVar67._0_4_ = (uint)bVar35 * iVar37 | (uint)!bVar35 * auVar74._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  iVar102 = auVar81._4_4_;
  auVar67._4_4_ = (uint)bVar35 * iVar102 | (uint)!bVar35 * auVar74._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  iVar103 = auVar81._8_4_;
  auVar67._8_4_ = (uint)bVar35 * iVar103 | (uint)!bVar35 * auVar74._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  iVar104 = auVar81._12_4_;
  auVar67._12_4_ = (uint)bVar35 * iVar104 | (uint)!bVar35 * auVar74._12_4_;
  bVar35 = (bool)((byte)(uVar32 >> 4) & 1);
  iVar105 = auVar81._16_4_;
  auVar67._16_4_ = (uint)bVar35 * iVar105 | (uint)!bVar35 * auVar74._16_4_;
  bVar35 = (bool)((byte)(uVar32 >> 5) & 1);
  iVar106 = auVar81._20_4_;
  auVar67._20_4_ = (uint)bVar35 * iVar106 | (uint)!bVar35 * auVar74._20_4_;
  bVar35 = (bool)((byte)(uVar32 >> 6) & 1);
  iVar107 = auVar81._24_4_;
  iVar108 = auVar81._28_4_;
  auVar67._24_4_ = (uint)bVar35 * iVar107 | (uint)!bVar35 * auVar74._24_4_;
  bVar35 = SUB81(uVar32 >> 7,0);
  auVar67._28_4_ = (uint)bVar35 * iVar108 | (uint)!bVar35 * auVar74._28_4_;
  auVar80 = vandps_avx(auVar73,auVar79);
  uVar32 = vcmpps_avx512vl(auVar80,auVar81,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar68._0_4_ = (uint)bVar35 * iVar37 | (uint)!bVar35 * auVar79._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar35 * iVar102 | (uint)!bVar35 * auVar79._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar35 * iVar103 | (uint)!bVar35 * auVar79._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar35 * iVar104 | (uint)!bVar35 * auVar79._12_4_;
  bVar35 = (bool)((byte)(uVar32 >> 4) & 1);
  auVar68._16_4_ = (uint)bVar35 * iVar105 | (uint)!bVar35 * auVar79._16_4_;
  bVar35 = (bool)((byte)(uVar32 >> 5) & 1);
  auVar68._20_4_ = (uint)bVar35 * iVar106 | (uint)!bVar35 * auVar79._20_4_;
  bVar35 = (bool)((byte)(uVar32 >> 6) & 1);
  auVar68._24_4_ = (uint)bVar35 * iVar107 | (uint)!bVar35 * auVar79._24_4_;
  bVar35 = SUB81(uVar32 >> 7,0);
  auVar68._28_4_ = (uint)bVar35 * iVar108 | (uint)!bVar35 * auVar79._28_4_;
  auVar80 = vandps_avx(auVar73,ZEXT1632(auVar40));
  uVar32 = vcmpps_avx512vl(auVar80,auVar81,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar80._0_4_ = (uint)bVar35 * iVar37 | (uint)!bVar35 * auVar40._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar35 * iVar102 | (uint)!bVar35 * auVar40._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar35 * iVar103 | (uint)!bVar35 * auVar40._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar35 * iVar104 | (uint)!bVar35 * auVar40._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * iVar105;
  auVar80._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * iVar106;
  auVar80._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * iVar107;
  auVar80._28_4_ = (uint)(byte)(uVar32 >> 7) * iVar108;
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  auVar81 = vrcp14ps_avx512vl(auVar67);
  auVar40 = vfnmadd213ps_fma(auVar67,auVar81,auVar74);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar68);
  auVar38 = vfnmadd213ps_fma(auVar68,auVar81,auVar74);
  auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar80);
  auVar39 = vfnmadd213ps_fma(auVar80,auVar81,auVar74);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar81,auVar81);
  auVar69._4_4_ = fVar147;
  auVar69._0_4_ = fVar147;
  auVar69._8_4_ = fVar147;
  auVar69._12_4_ = fVar147;
  auVar69._16_4_ = fVar147;
  auVar69._20_4_ = fVar147;
  auVar69._24_4_ = fVar147;
  auVar69._28_4_ = fVar147;
  auVar80 = vcvtdq2ps_avx(auVar82);
  auVar81 = vcvtdq2ps_avx(auVar83);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar51 = vfmadd213ps_fma(auVar81,auVar69,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar84);
  auVar81 = vcvtdq2ps_avx(auVar85);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar54 = vfmadd213ps_fma(auVar81,auVar69,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar86);
  auVar81 = vcvtdq2ps_avx(auVar87);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar55 = vfmadd213ps_fma(auVar81,auVar69,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar88);
  auVar81 = vcvtdq2ps_avx(auVar89);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar52 = vfmadd213ps_fma(auVar81,auVar69,auVar80);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x1d + 6));
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x21 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar53 = vfmadd213ps_fma(auVar81,auVar69,auVar80);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x1f + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x23 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar57 = vfmadd213ps_fma(auVar81,auVar69,auVar80);
  auVar80 = vsubps_avx512vl(ZEXT1632(auVar51),auVar65);
  auVar72._4_4_ = auVar40._4_4_ * auVar80._4_4_;
  auVar72._0_4_ = auVar40._0_4_ * auVar80._0_4_;
  auVar72._8_4_ = auVar40._8_4_ * auVar80._8_4_;
  auVar72._12_4_ = auVar40._12_4_ * auVar80._12_4_;
  auVar72._16_4_ = auVar80._16_4_ * 0.0;
  auVar72._20_4_ = auVar80._20_4_ * 0.0;
  auVar72._24_4_ = auVar80._24_4_ * 0.0;
  auVar72._28_4_ = auVar80._28_4_;
  auVar80 = vsubps_avx512vl(ZEXT1632(auVar54),auVar65);
  auVar86._0_4_ = auVar40._0_4_ * auVar80._0_4_;
  auVar86._4_4_ = auVar40._4_4_ * auVar80._4_4_;
  auVar86._8_4_ = auVar40._8_4_ * auVar80._8_4_;
  auVar86._12_4_ = auVar40._12_4_ * auVar80._12_4_;
  auVar86._16_4_ = auVar80._16_4_ * 0.0;
  auVar86._20_4_ = auVar80._20_4_ * 0.0;
  auVar86._24_4_ = auVar80._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar80 = vsubps_avx(ZEXT1632(auVar55),auVar70);
  auVar82._4_4_ = auVar38._4_4_ * auVar80._4_4_;
  auVar82._0_4_ = auVar38._0_4_ * auVar80._0_4_;
  auVar82._8_4_ = auVar38._8_4_ * auVar80._8_4_;
  auVar82._12_4_ = auVar38._12_4_ * auVar80._12_4_;
  auVar82._16_4_ = auVar80._16_4_ * 0.0;
  auVar82._20_4_ = auVar80._20_4_ * 0.0;
  auVar82._24_4_ = auVar80._24_4_ * 0.0;
  auVar82._28_4_ = auVar80._28_4_;
  auVar80 = vsubps_avx(ZEXT1632(auVar52),auVar70);
  auVar85._0_4_ = auVar38._0_4_ * auVar80._0_4_;
  auVar85._4_4_ = auVar38._4_4_ * auVar80._4_4_;
  auVar85._8_4_ = auVar38._8_4_ * auVar80._8_4_;
  auVar85._12_4_ = auVar38._12_4_ * auVar80._12_4_;
  auVar85._16_4_ = auVar80._16_4_ * 0.0;
  auVar85._20_4_ = auVar80._20_4_ * 0.0;
  auVar85._24_4_ = auVar80._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar80 = vsubps_avx(ZEXT1632(auVar53),auVar78);
  auVar83._4_4_ = auVar39._4_4_ * auVar80._4_4_;
  auVar83._0_4_ = auVar39._0_4_ * auVar80._0_4_;
  auVar83._8_4_ = auVar39._8_4_ * auVar80._8_4_;
  auVar83._12_4_ = auVar39._12_4_ * auVar80._12_4_;
  auVar83._16_4_ = auVar80._16_4_ * 0.0;
  auVar83._20_4_ = auVar80._20_4_ * 0.0;
  auVar83._24_4_ = auVar80._24_4_ * 0.0;
  auVar83._28_4_ = auVar80._28_4_;
  auVar80 = vsubps_avx(ZEXT1632(auVar57),auVar78);
  auVar84._0_4_ = auVar39._0_4_ * auVar80._0_4_;
  auVar84._4_4_ = auVar39._4_4_ * auVar80._4_4_;
  auVar84._8_4_ = auVar39._8_4_ * auVar80._8_4_;
  auVar84._12_4_ = auVar39._12_4_ * auVar80._12_4_;
  auVar84._16_4_ = auVar80._16_4_ * 0.0;
  auVar84._20_4_ = auVar80._20_4_ * 0.0;
  auVar84._24_4_ = auVar80._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar80 = vpminsd_avx2(auVar72,auVar86);
  auVar81 = vpminsd_avx2(auVar82,auVar85);
  auVar80 = vmaxps_avx(auVar80,auVar81);
  auVar81 = vpminsd_avx2(auVar83,auVar84);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar78._4_4_ = uVar109;
  auVar78._0_4_ = uVar109;
  auVar78._8_4_ = uVar109;
  auVar78._12_4_ = uVar109;
  auVar78._16_4_ = uVar109;
  auVar78._20_4_ = uVar109;
  auVar78._24_4_ = uVar109;
  auVar78._28_4_ = uVar109;
  auVar81 = vmaxps_avx512vl(auVar81,auVar78);
  auVar80 = vmaxps_avx(auVar80,auVar81);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  auVar81._16_4_ = 0x3f7ffffa;
  auVar81._20_4_ = 0x3f7ffffa;
  auVar81._24_4_ = 0x3f7ffffa;
  auVar81._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar80,auVar81);
  auVar80 = vpmaxsd_avx2(auVar72,auVar86);
  auVar81 = vpmaxsd_avx2(auVar82,auVar85);
  auVar80 = vminps_avx(auVar80,auVar81);
  auVar81 = vpmaxsd_avx2(auVar83,auVar84);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar70._4_4_ = uVar109;
  auVar70._0_4_ = uVar109;
  auVar70._8_4_ = uVar109;
  auVar70._12_4_ = uVar109;
  auVar70._16_4_ = uVar109;
  auVar70._20_4_ = uVar109;
  auVar70._24_4_ = uVar109;
  auVar70._28_4_ = uVar109;
  auVar81 = vminps_avx512vl(auVar81,auVar70);
  auVar80 = vminps_avx(auVar80,auVar81);
  auVar71._8_4_ = 0x3f800003;
  auVar71._0_8_ = 0x3f8000033f800003;
  auVar71._12_4_ = 0x3f800003;
  auVar71._16_4_ = 0x3f800003;
  auVar71._20_4_ = 0x3f800003;
  auVar71._24_4_ = 0x3f800003;
  auVar71._28_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar71);
  auVar81 = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_1c0,auVar80,2);
  uVar19 = vpcmpgtd_avx512vl(auVar81,_DAT_01fb4ba0);
  uVar32 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar18 & (byte)uVar19));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar40 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
  auVar244 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar252 = ZEXT1664(auVar40);
LAB_01b5014c:
  if (uVar32 == 0) {
    return;
  }
  lVar29 = 0;
  for (uVar26 = uVar32; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  fVar147 = (pGVar9->time_range).lower;
  fVar147 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar147) / ((pGVar9->time_range).upper - fVar147));
  auVar40 = vroundss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),9);
  uVar7 = *(uint *)(prim + lVar29 * 4 + 6);
  auVar38 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar40 = vminss_avx(auVar40,auVar38);
  auVar41 = vmaxss_avx512f(auVar244._0_16_,auVar40);
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar30 = (long)(int)auVar41._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar30);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar30);
  auVar40 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  lVar29 = uVar26 + 1;
  auVar38 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  lVar1 = uVar26 + 2;
  auVar39 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar26 + 3;
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar30);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar30);
  auVar54 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar26);
  auVar55 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar29);
  auVar52 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar53 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar30);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar30);
  auVar57 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar26);
  auVar58 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar29);
  auVar59 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar111 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar30);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar30);
  auVar116 = *(undefined1 (*) [16])(lVar12 + uVar26 * lVar11);
  auVar117 = *(undefined1 (*) [16])(lVar12 + lVar29 * lVar11);
  auVar60 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar147),auVar41);
  auVar110._0_12_ = ZEXT812(0);
  auVar110._12_4_ = 0;
  auVar41 = vmulps_avx512vl(auVar51,auVar110);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar44 = vfmadd213ps_avx512vl(auVar43,auVar39,auVar41);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar38,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar43);
  auVar61 = auVar252._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar61);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar38,auVar110);
  auVar47 = vfnmadd231ps_avx512vl(auVar41,auVar40,auVar61);
  auVar44._0_4_ = auVar53._0_4_ * 0.0;
  auVar44._4_4_ = auVar53._4_4_ * 0.0;
  auVar44._8_4_ = auVar53._8_4_ * 0.0;
  auVar44._12_4_ = auVar53._12_4_ * 0.0;
  auVar41 = vfmadd213ps_avx512vl(auVar43,auVar52,auVar44);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar55,auVar45);
  auVar48 = vfmadd231ps_avx512vl(auVar41,auVar54,auVar43);
  auVar41 = vfmadd231ps_avx512vl(auVar44,auVar52,auVar61);
  auVar41 = vfnmadd231ps_fma(auVar41,auVar55,auVar110);
  auVar49 = vfnmadd231ps_avx512vl(auVar41,auVar54,auVar61);
  auVar41 = vmulps_avx512vl(auVar51,auVar43);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar45);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar38,auVar43);
  auVar50 = vfmadd231ps_avx512vl(auVar41,auVar40,auVar110);
  auVar51 = vmulps_avx512vl(auVar51,auVar61);
  auVar39 = vfmadd231ps_fma(auVar51,auVar110,auVar39);
  auVar38 = vfnmadd231ps_avx512vl(auVar39,auVar61,auVar38);
  auVar44 = vfnmadd231ps_fma(auVar38,auVar110,auVar40);
  auVar40 = vmulps_avx512vl(auVar53,auVar43);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar52,auVar45);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar55,auVar43);
  auVar41 = vfmadd231ps_fma(auVar40,auVar54,auVar110);
  auVar40 = vmulps_avx512vl(auVar53,auVar61);
  auVar40 = vfmadd231ps_fma(auVar40,auVar110,auVar52);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar61,auVar55);
  auVar55 = vfnmadd231ps_fma(auVar40,auVar110,auVar54);
  auVar38 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar40 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar40 = vmulps_avx512vl(auVar47,auVar40);
  auVar40 = vfmsub231ps_avx512vl(auVar40,auVar38,auVar48);
  auVar39 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar40 = vmulps_avx512vl(auVar47,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar38,auVar49);
  auVar51 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar38 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar62._0_4_ = auVar44._0_4_ * auVar38._0_4_;
  auVar62._4_4_ = auVar44._4_4_ * auVar38._4_4_;
  auVar62._8_4_ = auVar44._8_4_ * auVar38._8_4_;
  auVar62._12_4_ = auVar44._12_4_ * auVar38._12_4_;
  auVar38 = vfmsub231ps_fma(auVar62,auVar40,auVar41);
  auVar54 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar63._0_4_ = auVar44._0_4_ * auVar38._0_4_;
  auVar63._4_4_ = auVar44._4_4_ * auVar38._4_4_;
  auVar63._8_4_ = auVar44._8_4_ * auVar38._8_4_;
  auVar63._12_4_ = auVar44._12_4_ * auVar38._12_4_;
  auVar40 = vfmsub231ps_fma(auVar63,auVar40,auVar55);
  auVar55 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar39,auVar39,0x7f);
  auVar38 = vrsqrt14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar52 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  auVar53 = vmulss_avx512f(auVar53,auVar38);
  auVar38 = vmulss_avx512f(auVar53,ZEXT416((uint)(auVar38._0_4_ * auVar38._0_4_)));
  fVar147 = auVar52._0_4_ + auVar38._0_4_;
  auVar167._4_4_ = fVar147;
  auVar167._0_4_ = fVar147;
  auVar167._8_4_ = fVar147;
  auVar167._12_4_ = fVar147;
  auVar38 = vdpps_avx(auVar39,auVar51,0x7f);
  auVar52 = vmulps_avx512vl(auVar39,auVar167);
  auVar53 = vbroadcastss_avx512vl(auVar40);
  auVar51 = vmulps_avx512vl(auVar53,auVar51);
  fVar215 = auVar38._0_4_;
  auVar49._0_4_ = fVar215 * auVar39._0_4_;
  auVar49._4_4_ = fVar215 * auVar39._4_4_;
  auVar49._8_4_ = fVar215 * auVar39._8_4_;
  auVar49._12_4_ = fVar215 * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar51,auVar49);
  auVar38 = vrcp14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar38,ZEXT416(0x40000000));
  fVar201 = auVar38._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar38 = vrsqrt14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar51 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar215 = auVar38._0_4_;
  fVar215 = auVar51._0_4_ + auVar53._0_4_ * fVar215 * fVar215 * fVar215;
  auVar168._0_4_ = auVar54._0_4_ * fVar215;
  auVar168._4_4_ = auVar54._4_4_ * fVar215;
  auVar168._8_4_ = auVar54._8_4_ * fVar215;
  auVar168._12_4_ = auVar54._12_4_ * fVar215;
  auVar38 = vdpps_avx(auVar54,auVar55,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar40);
  auVar51 = vmulps_avx512vl(auVar51,auVar55);
  fVar210 = auVar38._0_4_;
  auVar41._0_4_ = fVar210 * auVar54._0_4_;
  auVar41._4_4_ = fVar210 * auVar54._4_4_;
  auVar41._8_4_ = fVar210 * auVar54._8_4_;
  auVar41._12_4_ = fVar210 * auVar54._12_4_;
  auVar38 = vsubps_avx(auVar51,auVar41);
  auVar51 = vrcp14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar51,ZEXT416(0x40000000));
  fVar210 = auVar51._0_4_ * auVar40._0_4_;
  auVar40 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar51 = vmulps_avx512vl(auVar40,auVar52);
  auVar53 = vsubps_avx512vl(auVar46,auVar51);
  auVar54 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar52);
  auVar48._0_4_ = auVar54._0_4_ + auVar40._0_4_ * fVar147 * fVar201 * auVar39._0_4_;
  auVar48._4_4_ = auVar54._4_4_ + auVar40._4_4_ * fVar147 * fVar201 * auVar39._4_4_;
  auVar48._8_4_ = auVar54._8_4_ + auVar40._8_4_ * fVar147 * fVar201 * auVar39._8_4_;
  auVar48._12_4_ = auVar54._12_4_ + auVar40._12_4_ * fVar147 * fVar201 * auVar39._12_4_;
  auVar39 = vsubps_avx512vl(auVar47,auVar48);
  auVar41 = vaddps_avx512vl(auVar46,auVar51);
  auVar51 = vaddps_avx512vl(auVar47,auVar48);
  auVar40 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar54 = vmulps_avx512vl(auVar40,auVar168);
  auVar46 = vsubps_avx512vl(auVar50,auVar54);
  auVar55 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar168);
  auVar169._0_4_ = auVar55._0_4_ + auVar40._0_4_ * fVar215 * auVar38._0_4_ * fVar210;
  auVar169._4_4_ = auVar55._4_4_ + auVar40._4_4_ * fVar215 * auVar38._4_4_ * fVar210;
  auVar169._8_4_ = auVar55._8_4_ + auVar40._8_4_ * fVar215 * auVar38._8_4_ * fVar210;
  auVar169._12_4_ = auVar55._12_4_ + auVar40._12_4_ * fVar215 * auVar38._12_4_ * fVar210;
  auVar40 = vsubps_avx(auVar44,auVar169);
  auVar47 = vaddps_avx512vl(auVar50,auVar54);
  auVar38 = vaddps_avx512vl(auVar44,auVar169);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar39 = vmulps_avx512vl(auVar39,auVar44);
  auVar158._0_4_ = auVar53._0_4_ + auVar39._0_4_;
  auVar158._4_4_ = auVar53._4_4_ + auVar39._4_4_;
  auVar158._8_4_ = auVar53._8_4_ + auVar39._8_4_;
  auVar158._12_4_ = auVar53._12_4_ + auVar39._12_4_;
  auVar40 = vmulps_avx512vl(auVar40,auVar44);
  auVar52 = vsubps_avx(auVar46,auVar40);
  auVar40 = vmulps_avx512vl(auVar51,auVar44);
  local_550._4_4_ = auVar41._4_4_ + auVar40._4_4_;
  local_550._0_4_ = auVar41._0_4_ + auVar40._0_4_;
  fStack_548 = auVar41._8_4_ + auVar40._8_4_;
  fStack_544 = auVar41._12_4_ + auVar40._12_4_;
  auVar40 = vmulps_avx512vl(auVar38,auVar44);
  auVar48 = vsubps_avx512vl(auVar47,auVar40);
  auVar40 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar38 = vmulps_avx512vl(auVar111,auVar110);
  auVar39 = vfmadd213ps_avx512vl(auVar43,auVar59,auVar38);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar58,auVar45);
  auVar49 = vfmadd231ps_avx512vl(auVar39,auVar57,auVar43);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar59,auVar61);
  auVar38 = vfnmadd231ps_fma(auVar38,auVar58,auVar110);
  auVar50 = vfnmadd231ps_avx512vl(auVar38,auVar57,auVar61);
  auVar38 = vmulps_avx512vl(auVar40,auVar110);
  auVar39 = vfmadd213ps_avx512vl(auVar43,auVar60,auVar38);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar117,auVar45);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar116,auVar43);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar60,auVar61);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar117,auVar110);
  auVar51 = vfnmadd231ps_avx512vl(auVar38,auVar116,auVar61);
  auVar38 = vmulps_avx512vl(auVar111,auVar43);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar59,auVar45);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar58,auVar43);
  auVar56 = vfmadd231ps_avx512vl(auVar38,auVar57,auVar110);
  auVar38 = vmulps_avx512vl(auVar111,auVar61);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar110,auVar59);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar61,auVar58);
  auVar57 = vfnmadd231ps_avx512vl(auVar38,auVar110,auVar57);
  auVar38 = vmulps_avx512vl(auVar40,auVar43);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar60,auVar45);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar117,auVar43);
  auVar38 = vfmadd231ps_fma(auVar38,auVar116,auVar110);
  auVar40 = vmulps_avx512vl(auVar40,auVar61);
  auVar40 = vfmadd231ps_fma(auVar40,auVar110,auVar60);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar61,auVar117);
  auVar55 = vfnmadd231ps_fma(auVar40,auVar110,auVar116);
  auVar40 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar54 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  fVar210 = auVar50._0_4_;
  auVar216._0_4_ = fVar210 * auVar54._0_4_;
  fVar211 = auVar50._4_4_;
  auVar216._4_4_ = fVar211 * auVar54._4_4_;
  fVar129 = auVar50._8_4_;
  auVar216._8_4_ = fVar129 * auVar54._8_4_;
  fVar135 = auVar50._12_4_;
  auVar216._12_4_ = fVar135 * auVar54._12_4_;
  auVar39 = vfmsub231ps_avx512vl(auVar216,auVar40,auVar39);
  auVar39 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar54 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar226._0_4_ = fVar210 * auVar54._0_4_;
  auVar226._4_4_ = fVar211 * auVar54._4_4_;
  auVar226._8_4_ = fVar129 * auVar54._8_4_;
  auVar226._12_4_ = fVar135 * auVar54._12_4_;
  auVar40 = vfmsub231ps_avx512vl(auVar226,auVar40,auVar51);
  auVar51 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar58 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar40 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar40 = vmulps_avx512vl(auVar57,auVar40);
  auVar40 = vfmsub231ps_fma(auVar40,auVar58,auVar38);
  auVar54 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar38 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar40 = vdpps_avx(auVar39,auVar39,0x7f);
  auVar38 = vmulps_avx512vl(auVar57,auVar38);
  auVar38 = vfmsub231ps_fma(auVar38,auVar58,auVar55);
  auVar55 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vrsqrt14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar58 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  auVar59 = vmulss_avx512f(auVar59,auVar38);
  auVar38 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar38._0_4_ * auVar38._0_4_)));
  auVar38 = vaddss_avx512f(auVar58,auVar38);
  auVar237._0_4_ = auVar38._0_4_;
  auVar237._4_4_ = auVar237._0_4_;
  auVar237._8_4_ = auVar237._0_4_;
  auVar237._12_4_ = auVar237._0_4_;
  auVar58 = vmulps_avx512vl(auVar39,auVar237);
  auVar38 = vdpps_avx(auVar39,auVar51,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar40);
  auVar51 = vmulps_avx512vl(auVar59,auVar51);
  fVar147 = auVar38._0_4_;
  auVar60._0_4_ = auVar39._0_4_ * fVar147;
  auVar60._4_4_ = auVar39._4_4_ * fVar147;
  auVar60._8_4_ = auVar39._8_4_ * fVar147;
  auVar60._12_4_ = auVar39._12_4_ * fVar147;
  auVar39 = vsubps_avx(auVar51,auVar60);
  auVar38 = vrcp14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar38,ZEXT416(0x40000000));
  fVar215 = auVar38._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar38 = vrsqrt14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar51 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar147 = auVar38._0_4_;
  fVar147 = auVar51._0_4_ + auVar59._0_4_ * fVar147 * fVar147 * fVar147;
  auVar232._0_4_ = auVar54._0_4_ * fVar147;
  auVar232._4_4_ = auVar54._4_4_ * fVar147;
  auVar232._8_4_ = auVar54._8_4_ * fVar147;
  auVar232._12_4_ = auVar54._12_4_ * fVar147;
  auVar38 = vdpps_avx(auVar54,auVar55,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar40);
  auVar51 = vmulps_avx512vl(auVar51,auVar55);
  fVar201 = auVar38._0_4_;
  auVar193._0_4_ = fVar201 * auVar54._0_4_;
  auVar193._4_4_ = fVar201 * auVar54._4_4_;
  auVar193._8_4_ = fVar201 * auVar54._8_4_;
  auVar193._12_4_ = fVar201 * auVar54._12_4_;
  auVar38 = vsubps_avx(auVar51,auVar193);
  auVar51 = vrcp14ss_avx512f(auVar110,ZEXT416(auVar40._0_4_));
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar51,ZEXT416(0x40000000));
  auVar249 = ZEXT464(0x3f800000);
  fVar201 = auVar40._0_4_ * auVar51._0_4_;
  auVar51 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar54 = vmulps_avx512vl(auVar51,auVar58);
  auVar55 = vsubps_avx512vl(auVar49,auVar54);
  auVar40 = vshufps_avx(auVar50,auVar50,0xff);
  auVar40 = vmulps_avx512vl(auVar40,auVar58);
  auVar61._0_4_ = auVar40._0_4_ + auVar51._0_4_ * auVar237._0_4_ * fVar215 * auVar39._0_4_;
  auVar61._4_4_ = auVar40._4_4_ + auVar51._4_4_ * auVar237._0_4_ * fVar215 * auVar39._4_4_;
  auVar61._8_4_ = auVar40._8_4_ + auVar51._8_4_ * auVar237._0_4_ * fVar215 * auVar39._8_4_;
  auVar61._12_4_ = auVar40._12_4_ + auVar51._12_4_ * auVar237._0_4_ * fVar215 * auVar39._12_4_;
  auVar40 = vsubps_avx(auVar50,auVar61);
  auVar39 = vaddps_avx512vl(auVar49,auVar54);
  auVar50._0_4_ = fVar210 + auVar61._0_4_;
  auVar50._4_4_ = fVar211 + auVar61._4_4_;
  auVar50._8_4_ = fVar129 + auVar61._8_4_;
  auVar50._12_4_ = fVar135 + auVar61._12_4_;
  auVar51 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar227._0_4_ = auVar51._0_4_ * auVar232._0_4_;
  auVar227._4_4_ = auVar51._4_4_ * auVar232._4_4_;
  auVar227._8_4_ = auVar51._8_4_ * auVar232._8_4_;
  auVar227._12_4_ = auVar51._12_4_ * auVar232._12_4_;
  auVar54 = vsubps_avx512vl(auVar56,auVar227);
  auVar58 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar58 = vmulps_avx512vl(auVar58,auVar232);
  auVar64._0_4_ = auVar58._0_4_ + auVar51._0_4_ * fVar147 * auVar38._0_4_ * fVar201;
  auVar64._4_4_ = auVar58._4_4_ + auVar51._4_4_ * fVar147 * auVar38._4_4_ * fVar201;
  auVar64._8_4_ = auVar58._8_4_ + auVar51._8_4_ * fVar147 * auVar38._8_4_ * fVar201;
  auVar64._12_4_ = auVar58._12_4_ + auVar51._12_4_ * fVar147 * auVar38._12_4_ * fVar201;
  auVar38 = vsubps_avx512vl(auVar57,auVar64);
  auVar51 = vaddps_avx512vl(auVar56,auVar227);
  auVar57 = vaddps_avx512vl(auVar57,auVar64);
  auVar40 = vmulps_avx512vl(auVar40,auVar44);
  auVar194._0_4_ = auVar55._0_4_ + auVar40._0_4_;
  auVar194._4_4_ = auVar55._4_4_ + auVar40._4_4_;
  auVar194._8_4_ = auVar55._8_4_ + auVar40._8_4_;
  auVar194._12_4_ = auVar55._12_4_ + auVar40._12_4_;
  auVar40 = vmulps_avx512vl(auVar38,auVar44);
  auVar40 = vsubps_avx(auVar54,auVar40);
  auVar38 = vmulps_avx512vl(auVar50,auVar44);
  auVar56._0_4_ = auVar39._0_4_ + auVar38._0_4_;
  auVar56._4_4_ = auVar39._4_4_ + auVar38._4_4_;
  auVar56._8_4_ = auVar39._8_4_ + auVar38._8_4_;
  auVar56._12_4_ = auVar39._12_4_ + auVar38._12_4_;
  auVar38 = vmulps_avx512vl(auVar57,auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar250 = ZEXT1664(auVar44);
  auVar38 = vsubps_avx(auVar51,auVar38);
  auVar57 = vbroadcastss_avx512vl(auVar42);
  auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
  auVar59._0_4_ = auVar58._0_4_;
  auVar59._4_4_ = auVar59._0_4_;
  auVar59._8_4_ = auVar59._0_4_;
  auVar59._12_4_ = auVar59._0_4_;
  auVar55 = vmulps_avx512vl(auVar57,auVar55);
  auVar58 = vmulps_avx512vl(auVar57,auVar194);
  auVar40 = vmulps_avx512vl(auVar57,auVar40);
  auVar238._0_4_ = auVar57._0_4_ * auVar54._0_4_;
  auVar238._4_4_ = auVar57._4_4_ * auVar54._4_4_;
  auVar238._8_4_ = auVar57._8_4_ * auVar54._8_4_;
  auVar238._12_4_ = auVar57._12_4_ * auVar54._12_4_;
  local_360 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar53);
  local_370 = vfmadd231ps_avx512vl(auVar58,auVar59,auVar158);
  local_380 = vfmadd231ps_avx512vl(auVar40,auVar59,auVar52);
  local_390 = vfmadd231ps_fma(auVar238,auVar59,auVar46);
  auVar40 = vmulps_avx512vl(auVar57,auVar39);
  auVar39 = vmulps_avx512vl(auVar57,auVar56);
  auVar38 = vmulps_avx512vl(auVar57,auVar38);
  auVar228._0_4_ = auVar57._0_4_ * auVar51._0_4_;
  auVar228._4_4_ = auVar57._4_4_ * auVar51._4_4_;
  auVar228._8_4_ = auVar57._8_4_ * auVar51._8_4_;
  auVar228._12_4_ = auVar57._12_4_ * auVar51._12_4_;
  _local_3a0 = vfmadd231ps_avx512vl(auVar40,auVar59,auVar41);
  _local_3b0 = vfmadd231ps_avx512vl(auVar39,auVar59,_local_550);
  _local_3c0 = vfmadd231ps_avx512vl(auVar38,auVar59,auVar48);
  _local_3d0 = vfmadd231ps_fma(auVar228,auVar59,auVar47);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar147 = *(float *)(ray + k * 4 + 0x60);
  local_2e0 = vsubps_avx512vl(local_360,auVar40);
  uVar109 = local_2e0._0_4_;
  auVar116._4_4_ = uVar109;
  auVar116._0_4_ = uVar109;
  auVar116._8_4_ = uVar109;
  auVar116._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar39 = vshufps_avx(local_2e0,local_2e0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar215 = pre->ray_space[k].vz.field_0.m128[0];
  fVar201 = pre->ray_space[k].vz.field_0.m128[1];
  fVar210 = pre->ray_space[k].vz.field_0.m128[2];
  fVar211 = pre->ray_space[k].vz.field_0.m128[3];
  auVar111._0_4_ = fVar215 * auVar39._0_4_;
  auVar111._4_4_ = fVar201 * auVar39._4_4_;
  auVar111._8_4_ = fVar210 * auVar39._8_4_;
  auVar111._12_4_ = fVar211 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar5,auVar38);
  auVar52 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar116);
  local_2f0 = vsubps_avx512vl(local_370,auVar40);
  uVar109 = local_2f0._0_4_;
  auVar42._4_4_ = uVar109;
  auVar42._0_4_ = uVar109;
  auVar42._8_4_ = uVar109;
  auVar42._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar39 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar117._0_4_ = fVar215 * auVar39._0_4_;
  auVar117._4_4_ = fVar201 * auVar39._4_4_;
  auVar117._8_4_ = fVar210 * auVar39._8_4_;
  auVar117._12_4_ = fVar211 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar5,auVar38);
  auVar53 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar42);
  local_300 = vsubps_avx512vl(local_380,auVar40);
  uVar109 = local_300._0_4_;
  auVar46._4_4_ = uVar109;
  auVar46._0_4_ = uVar109;
  auVar46._8_4_ = uVar109;
  auVar46._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_300,local_300,0x55);
  auVar39 = vshufps_avx(local_300,local_300,0xaa);
  auVar43._0_4_ = fVar215 * auVar39._0_4_;
  auVar43._4_4_ = fVar201 * auVar39._4_4_;
  auVar43._8_4_ = fVar210 * auVar39._8_4_;
  auVar43._12_4_ = fVar211 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar5,auVar38);
  auVar57 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar46);
  local_310 = vsubps_avx(local_390,auVar40);
  uVar109 = local_310._0_4_;
  auVar170._4_4_ = uVar109;
  auVar170._0_4_ = uVar109;
  auVar170._8_4_ = uVar109;
  auVar170._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_310,local_310,0x55);
  auVar39 = vshufps_avx(local_310,local_310,0xaa);
  auVar47._0_4_ = fVar215 * auVar39._0_4_;
  auVar47._4_4_ = fVar201 * auVar39._4_4_;
  auVar47._8_4_ = fVar210 * auVar39._8_4_;
  auVar47._12_4_ = fVar211 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar5,auVar38);
  auVar58 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar170);
  local_320 = vsubps_avx512vl(_local_3a0,auVar40);
  uVar109 = local_320._0_4_;
  auVar171._4_4_ = uVar109;
  auVar171._0_4_ = uVar109;
  auVar171._8_4_ = uVar109;
  auVar171._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_320,local_320,0x55);
  auVar39 = vshufps_avx(local_320,local_320,0xaa);
  auVar195._0_4_ = auVar39._0_4_ * fVar215;
  auVar195._4_4_ = auVar39._4_4_ * fVar201;
  auVar195._8_4_ = auVar39._8_4_ * fVar210;
  auVar195._12_4_ = auVar39._12_4_ * fVar211;
  auVar38 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar38);
  auVar59 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar171);
  local_330 = vsubps_avx512vl(_local_3b0,auVar40);
  uVar109 = local_330._0_4_;
  auVar172._4_4_ = uVar109;
  auVar172._0_4_ = uVar109;
  auVar172._8_4_ = uVar109;
  auVar172._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_330,local_330,0x55);
  auVar39 = vshufps_avx(local_330,local_330,0xaa);
  auVar202._0_4_ = auVar39._0_4_ * fVar215;
  auVar202._4_4_ = auVar39._4_4_ * fVar201;
  auVar202._8_4_ = auVar39._8_4_ * fVar210;
  auVar202._12_4_ = auVar39._12_4_ * fVar211;
  auVar38 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar38);
  auVar111 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar172);
  local_340 = vsubps_avx512vl(_local_3c0,auVar40);
  uVar109 = local_340._0_4_;
  auVar173._4_4_ = uVar109;
  auVar173._0_4_ = uVar109;
  auVar173._8_4_ = uVar109;
  auVar173._12_4_ = uVar109;
  auVar38 = vshufps_avx(local_340,local_340,0x55);
  auVar39 = vshufps_avx(local_340,local_340,0xaa);
  auVar217._0_4_ = auVar39._0_4_ * fVar215;
  auVar217._4_4_ = auVar39._4_4_ * fVar201;
  auVar217._8_4_ = auVar39._8_4_ * fVar210;
  auVar217._12_4_ = auVar39._12_4_ * fVar211;
  auVar38 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar38);
  auVar116 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar173);
  local_350 = vsubps_avx(_local_3d0,auVar40);
  uVar109 = local_350._0_4_;
  auVar45._4_4_ = uVar109;
  auVar45._0_4_ = uVar109;
  auVar45._8_4_ = uVar109;
  auVar45._12_4_ = uVar109;
  auVar40 = vshufps_avx(local_350,local_350,0x55);
  auVar38 = vshufps_avx(local_350,local_350,0xaa);
  auVar159._0_4_ = auVar38._0_4_ * fVar215;
  auVar159._4_4_ = auVar38._4_4_ * fVar201;
  auVar159._8_4_ = auVar38._8_4_ * fVar210;
  auVar159._12_4_ = auVar38._12_4_ * fVar211;
  auVar40 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar5,auVar40);
  auVar117 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar45);
  auVar39 = vmovlhps_avx(auVar52,auVar59);
  auVar51 = vmovlhps_avx(auVar53,auVar111);
  auVar54 = vmovlhps_avx(auVar57,auVar116);
  _local_2c0 = vmovlhps_avx512f(auVar58,auVar117);
  auVar38 = vminps_avx(auVar39,auVar51);
  auVar40 = vmaxps_avx(auVar39,auVar51);
  auVar55 = vminps_avx512vl(auVar54,_local_2c0);
  auVar38 = vminps_avx(auVar38,auVar55);
  auVar55 = vmaxps_avx512vl(auVar54,_local_2c0);
  auVar40 = vmaxps_avx(auVar40,auVar55);
  auVar55 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vminps_avx(auVar38,auVar55);
  auVar55 = vshufpd_avx(auVar40,auVar40,3);
  auVar40 = vmaxps_avx(auVar40,auVar55);
  auVar38 = vandps_avx512vl(auVar38,auVar44);
  auVar40 = vandps_avx512vl(auVar40,auVar44);
  auVar40 = vmaxps_avx(auVar38,auVar40);
  auVar38 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar38,auVar40);
  auVar38 = vmovddup_avx512vl(auVar52);
  auVar55 = vmovddup_avx512vl(auVar53);
  auVar52 = vmovddup_avx512vl(auVar57);
  auVar53 = vmovddup_avx512vl(auVar58);
  local_2d0 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2d0);
  auVar40 = vxorps_avx512vl(local_260._0_16_,auVar60);
  local_280 = vbroadcastss_avx512vl(auVar40);
  uVar26 = 0;
  local_290 = vsubps_avx(auVar51,auVar39);
  local_2a0 = vsubps_avx(auVar54,auVar51);
  local_2b0 = vsubps_avx512vl(_local_2c0,auVar54);
  local_3e0 = vsubps_avx512vl(_local_3a0,local_360);
  local_3f0 = vsubps_avx512vl(_local_3b0,local_370);
  local_400 = vsubps_avx512vl(_local_3c0,local_380);
  _local_410 = vsubps_avx(_local_3d0,local_390);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar58 = auVar40;
LAB_01b50ca6:
  do {
    auVar57 = vshufps_avx(auVar58,auVar58,0x50);
    auVar233._8_4_ = 0x3f800000;
    auVar233._0_8_ = 0x3f8000003f800000;
    auVar233._12_4_ = 0x3f800000;
    auVar236._16_4_ = 0x3f800000;
    auVar236._0_16_ = auVar233;
    auVar236._20_4_ = 0x3f800000;
    auVar236._24_4_ = 0x3f800000;
    auVar236._28_4_ = 0x3f800000;
    auVar60 = vsubps_avx(auVar233,auVar57);
    fVar215 = auVar57._0_4_;
    fVar129 = auVar59._0_4_;
    auVar130._0_4_ = fVar129 * fVar215;
    fVar201 = auVar57._4_4_;
    fVar135 = auVar59._4_4_;
    auVar130._4_4_ = fVar135 * fVar201;
    fVar210 = auVar57._8_4_;
    auVar130._8_4_ = fVar129 * fVar210;
    fVar211 = auVar57._12_4_;
    auVar130._12_4_ = fVar135 * fVar211;
    fVar136 = auVar111._0_4_;
    auVar137._0_4_ = fVar136 * fVar215;
    fVar146 = auVar111._4_4_;
    auVar137._4_4_ = fVar146 * fVar201;
    auVar137._8_4_ = fVar136 * fVar210;
    auVar137._12_4_ = fVar146 * fVar211;
    fVar148 = auVar116._0_4_;
    auVar149._0_4_ = fVar148 * fVar215;
    fVar156 = auVar116._4_4_;
    auVar149._4_4_ = fVar156 * fVar201;
    auVar149._8_4_ = fVar148 * fVar210;
    auVar149._12_4_ = fVar156 * fVar211;
    fVar157 = auVar117._0_4_;
    auVar119._0_4_ = fVar157 * fVar215;
    fVar165 = auVar117._4_4_;
    auVar119._4_4_ = fVar165 * fVar201;
    auVar119._8_4_ = fVar157 * fVar210;
    auVar119._12_4_ = fVar165 * fVar211;
    auVar41 = vfmadd231ps_avx512vl(auVar130,auVar60,auVar38);
    auVar44 = vfmadd231ps_avx512vl(auVar137,auVar60,auVar55);
    auVar42 = vfmadd231ps_avx512vl(auVar149,auVar60,auVar52);
    auVar60 = vfmadd231ps_avx512vl(auVar119,auVar53,auVar60);
    auVar57 = vmovshdup_avx(auVar40);
    fVar201 = auVar40._0_4_;
    fVar215 = (auVar57._0_4_ - fVar201) * 0.04761905;
    auVar181._4_4_ = fVar201;
    auVar181._0_4_ = fVar201;
    auVar181._8_4_ = fVar201;
    auVar181._12_4_ = fVar201;
    auVar181._16_4_ = fVar201;
    auVar181._20_4_ = fVar201;
    auVar181._24_4_ = fVar201;
    auVar181._28_4_ = fVar201;
    auVar127._0_8_ = auVar57._0_8_;
    auVar127._8_8_ = auVar127._0_8_;
    auVar127._16_8_ = auVar127._0_8_;
    auVar127._24_8_ = auVar127._0_8_;
    auVar80 = vsubps_avx(auVar127,auVar181);
    uVar109 = auVar41._0_4_;
    auVar128._4_4_ = uVar109;
    auVar128._0_4_ = uVar109;
    auVar128._8_4_ = uVar109;
    auVar128._12_4_ = uVar109;
    auVar128._16_4_ = uVar109;
    auVar128._20_4_ = uVar109;
    auVar128._24_4_ = uVar109;
    auVar128._28_4_ = uVar109;
    auVar198._8_4_ = 1;
    auVar198._0_8_ = 0x100000001;
    auVar198._12_4_ = 1;
    auVar198._16_4_ = 1;
    auVar198._20_4_ = 1;
    auVar198._24_4_ = 1;
    auVar198._28_4_ = 1;
    auVar70 = ZEXT1632(auVar41);
    auVar81 = vpermps_avx2(auVar198,auVar70);
    auVar78 = vbroadcastss_avx512vl(auVar44);
    auVar88 = ZEXT1632(auVar44);
    auVar71 = vpermps_avx512vl(auVar198,auVar88);
    auVar79 = vbroadcastss_avx512vl(auVar42);
    auVar89 = ZEXT1632(auVar42);
    auVar72 = vpermps_avx512vl(auVar198,auVar89);
    auVar82 = vbroadcastss_avx512vl(auVar60);
    auVar87 = ZEXT1632(auVar60);
    auVar83 = vpermps_avx512vl(auVar198,auVar87);
    auVar199._4_4_ = fVar215;
    auVar199._0_4_ = fVar215;
    auVar199._8_4_ = fVar215;
    auVar199._12_4_ = fVar215;
    auVar199._16_4_ = fVar215;
    auVar199._20_4_ = fVar215;
    auVar199._24_4_ = fVar215;
    auVar199._28_4_ = fVar215;
    auVar164._8_4_ = 2;
    auVar164._0_8_ = 0x200000002;
    auVar164._12_4_ = 2;
    auVar164._16_4_ = 2;
    auVar164._20_4_ = 2;
    auVar164._24_4_ = 2;
    auVar164._28_4_ = 2;
    auVar84 = vpermps_avx512vl(auVar164,auVar70);
    auVar85 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar86 = vpermps_avx512vl(auVar85,auVar70);
    auVar66 = vpermps_avx512vl(auVar164,auVar88);
    auVar67 = vpermps_avx512vl(auVar85,auVar88);
    auVar70 = vpermps_avx2(auVar164,auVar89);
    auVar68 = vpermps_avx512vl(auVar85,auVar89);
    auVar69 = vpermps_avx512vl(auVar164,auVar87);
    auVar85 = vpermps_avx512vl(auVar85,auVar87);
    auVar57 = vfmadd132ps_fma(auVar80,auVar181,_DAT_01f7b040);
    auVar80 = vsubps_avx(auVar236,ZEXT1632(auVar57));
    auVar87 = vmulps_avx512vl(auVar78,ZEXT1632(auVar57));
    auVar89 = ZEXT1632(auVar57);
    auVar88 = vmulps_avx512vl(auVar71,auVar89);
    auVar60 = vfmadd231ps_fma(auVar87,auVar80,auVar128);
    auVar41 = vfmadd231ps_fma(auVar88,auVar80,auVar81);
    auVar87 = vmulps_avx512vl(auVar79,auVar89);
    auVar88 = vmulps_avx512vl(auVar72,auVar89);
    auVar78 = vfmadd231ps_avx512vl(auVar87,auVar80,auVar78);
    auVar71 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar71);
    auVar87 = vmulps_avx512vl(auVar82,auVar89);
    auVar73 = ZEXT1632(auVar57);
    auVar83 = vmulps_avx512vl(auVar83,auVar73);
    auVar79 = vfmadd231ps_avx512vl(auVar87,auVar80,auVar79);
    auVar72 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar72);
    fVar210 = auVar57._0_4_;
    fVar211 = auVar57._4_4_;
    auVar87._4_4_ = fVar211 * auVar78._4_4_;
    auVar87._0_4_ = fVar210 * auVar78._0_4_;
    fVar212 = auVar57._8_4_;
    auVar87._8_4_ = fVar212 * auVar78._8_4_;
    fVar213 = auVar57._12_4_;
    auVar87._12_4_ = fVar213 * auVar78._12_4_;
    auVar87._16_4_ = auVar78._16_4_ * 0.0;
    auVar87._20_4_ = auVar78._20_4_ * 0.0;
    auVar87._24_4_ = auVar78._24_4_ * 0.0;
    auVar87._28_4_ = fVar201;
    auVar88._4_4_ = fVar211 * auVar71._4_4_;
    auVar88._0_4_ = fVar210 * auVar71._0_4_;
    auVar88._8_4_ = fVar212 * auVar71._8_4_;
    auVar88._12_4_ = fVar213 * auVar71._12_4_;
    auVar88._16_4_ = auVar71._16_4_ * 0.0;
    auVar88._20_4_ = auVar71._20_4_ * 0.0;
    auVar88._24_4_ = auVar71._24_4_ * 0.0;
    auVar88._28_4_ = auVar81._28_4_;
    auVar60 = vfmadd231ps_fma(auVar87,auVar80,ZEXT1632(auVar60));
    auVar41 = vfmadd231ps_fma(auVar88,auVar80,ZEXT1632(auVar41));
    auVar76._0_4_ = fVar210 * auVar79._0_4_;
    auVar76._4_4_ = fVar211 * auVar79._4_4_;
    auVar76._8_4_ = fVar212 * auVar79._8_4_;
    auVar76._12_4_ = fVar213 * auVar79._12_4_;
    auVar76._16_4_ = auVar79._16_4_ * 0.0;
    auVar76._20_4_ = auVar79._20_4_ * 0.0;
    auVar76._24_4_ = auVar79._24_4_ * 0.0;
    auVar76._28_4_ = 0;
    auVar89._4_4_ = fVar211 * auVar72._4_4_;
    auVar89._0_4_ = fVar210 * auVar72._0_4_;
    auVar89._8_4_ = fVar212 * auVar72._8_4_;
    auVar89._12_4_ = fVar213 * auVar72._12_4_;
    auVar89._16_4_ = auVar72._16_4_ * 0.0;
    auVar89._20_4_ = auVar72._20_4_ * 0.0;
    auVar89._24_4_ = auVar72._24_4_ * 0.0;
    auVar89._28_4_ = auVar79._28_4_;
    auVar44 = vfmadd231ps_fma(auVar76,auVar80,auVar78);
    auVar42 = vfmadd231ps_fma(auVar89,auVar80,auVar71);
    auVar65._28_4_ = auVar71._28_4_;
    auVar65._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * auVar42._12_4_,
                            CONCAT48(fVar212 * auVar42._8_4_,
                                     CONCAT44(fVar211 * auVar42._4_4_,fVar210 * auVar42._0_4_))));
    auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar44._12_4_,
                                                 CONCAT48(fVar212 * auVar44._8_4_,
                                                          CONCAT44(fVar211 * auVar44._4_4_,
                                                                   fVar210 * auVar44._0_4_)))),
                              auVar80,ZEXT1632(auVar60));
    auVar45 = vfmadd231ps_fma(auVar65,auVar80,ZEXT1632(auVar41));
    auVar81 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar60));
    auVar78 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar41));
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar81 = vmulps_avx512vl(auVar81,auVar71);
    auVar78 = vmulps_avx512vl(auVar78,auVar71);
    auVar192._0_4_ = fVar215 * auVar81._0_4_;
    auVar192._4_4_ = fVar215 * auVar81._4_4_;
    auVar192._8_4_ = fVar215 * auVar81._8_4_;
    auVar192._12_4_ = fVar215 * auVar81._12_4_;
    auVar192._16_4_ = fVar215 * auVar81._16_4_;
    auVar192._20_4_ = fVar215 * auVar81._20_4_;
    auVar192._24_4_ = fVar215 * auVar81._24_4_;
    auVar192._28_4_ = 0;
    auVar81 = vmulps_avx512vl(auVar199,auVar78);
    auVar41 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01fb9fc0,ZEXT1632(auVar41));
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar45),_DAT_01fb9fc0,ZEXT1632(auVar41));
    auVar77._0_4_ = auVar192._0_4_ + auVar43._0_4_;
    auVar77._4_4_ = auVar192._4_4_ + auVar43._4_4_;
    auVar77._8_4_ = auVar192._8_4_ + auVar43._8_4_;
    auVar77._12_4_ = auVar192._12_4_ + auVar43._12_4_;
    auVar77._16_4_ = auVar192._16_4_ + 0.0;
    auVar77._20_4_ = auVar192._20_4_ + 0.0;
    auVar77._24_4_ = auVar192._24_4_ + 0.0;
    auVar77._28_4_ = 0;
    auVar65 = ZEXT1632(auVar41);
    auVar72 = vpermt2ps_avx512vl(auVar192,_DAT_01fb9fc0,auVar65);
    auVar82 = vaddps_avx512vl(ZEXT1632(auVar45),auVar81);
    auVar83 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar65);
    auVar81 = vsubps_avx(auVar78,auVar72);
    auVar72 = vsubps_avx512vl(auVar79,auVar83);
    auVar83 = vmulps_avx512vl(auVar66,auVar73);
    auVar87 = vmulps_avx512vl(auVar67,auVar73);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar84);
    auVar84 = vfmadd231ps_avx512vl(auVar87,auVar80,auVar86);
    auVar86 = vmulps_avx512vl(auVar70,auVar73);
    auVar87 = vmulps_avx512vl(auVar68,auVar73);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar66);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar80,auVar67);
    auVar88 = vmulps_avx512vl(auVar69,auVar73);
    auVar85 = vmulps_avx512vl(auVar85,auVar73);
    auVar60 = vfmadd231ps_fma(auVar88,auVar80,auVar70);
    auVar70 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar68);
    auVar85 = vmulps_avx512vl(auVar73,auVar86);
    auVar89 = ZEXT1632(auVar57);
    auVar88 = vmulps_avx512vl(auVar89,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar83);
    auVar84 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar84);
    auVar70 = vmulps_avx512vl(auVar89,auVar70);
    auVar85 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar213 * auVar60._12_4_,
                                            CONCAT48(fVar212 * auVar60._8_4_,
                                                     CONCAT44(fVar211 * auVar60._4_4_,
                                                              fVar210 * auVar60._0_4_)))),auVar80,
                         auVar86);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar80,auVar87);
    auVar66._4_4_ = fVar211 * auVar85._4_4_;
    auVar66._0_4_ = fVar210 * auVar85._0_4_;
    auVar66._8_4_ = fVar212 * auVar85._8_4_;
    auVar66._12_4_ = fVar213 * auVar85._12_4_;
    auVar66._16_4_ = auVar85._16_4_ * 0.0;
    auVar66._20_4_ = auVar85._20_4_ * 0.0;
    auVar66._24_4_ = auVar85._24_4_ * 0.0;
    auVar66._28_4_ = auVar68._28_4_;
    auVar86 = vmulps_avx512vl(auVar89,auVar70);
    auVar87 = vfmadd231ps_avx512vl(auVar66,auVar80,auVar83);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar80);
    auVar80 = vsubps_avx512vl(auVar85,auVar83);
    auVar70 = vsubps_avx512vl(auVar70,auVar84);
    auVar80 = vmulps_avx512vl(auVar80,auVar71);
    auVar70 = vmulps_avx512vl(auVar70,auVar71);
    fVar201 = fVar215 * auVar80._0_4_;
    fVar210 = fVar215 * auVar80._4_4_;
    auVar75._4_4_ = fVar210;
    auVar75._0_4_ = fVar201;
    fVar211 = fVar215 * auVar80._8_4_;
    auVar75._8_4_ = fVar211;
    fVar212 = fVar215 * auVar80._12_4_;
    auVar75._12_4_ = fVar212;
    fVar213 = fVar215 * auVar80._16_4_;
    auVar75._16_4_ = fVar213;
    fVar214 = fVar215 * auVar80._20_4_;
    auVar75._20_4_ = fVar214;
    fVar215 = fVar215 * auVar80._24_4_;
    auVar75._24_4_ = fVar215;
    auVar75._28_4_ = auVar80._28_4_;
    auVar70 = vmulps_avx512vl(auVar199,auVar70);
    auVar71 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,auVar65);
    auVar83 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar65);
    auVar200._0_4_ = auVar87._0_4_ + fVar201;
    auVar200._4_4_ = auVar87._4_4_ + fVar210;
    auVar200._8_4_ = auVar87._8_4_ + fVar211;
    auVar200._12_4_ = auVar87._12_4_ + fVar212;
    auVar200._16_4_ = auVar87._16_4_ + fVar213;
    auVar200._20_4_ = auVar87._20_4_ + fVar214;
    auVar200._24_4_ = auVar87._24_4_ + fVar215;
    auVar200._28_4_ = auVar87._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9fc0,ZEXT1632(auVar41));
    auVar84 = vaddps_avx512vl(auVar86,auVar70);
    auVar70 = vpermt2ps_avx512vl(auVar70,_DAT_01fb9fc0,ZEXT1632(auVar41));
    auVar80 = vsubps_avx(auVar71,auVar80);
    auVar70 = vsubps_avx512vl(auVar83,auVar70);
    auVar74 = ZEXT1632(auVar43);
    auVar85 = vsubps_avx512vl(auVar87,auVar74);
    auVar75 = ZEXT1632(auVar45);
    auVar88 = vsubps_avx512vl(auVar86,auVar75);
    auVar89 = vsubps_avx512vl(auVar71,auVar78);
    auVar85 = vaddps_avx512vl(auVar85,auVar89);
    auVar89 = vsubps_avx512vl(auVar83,auVar79);
    auVar88 = vaddps_avx512vl(auVar88,auVar89);
    auVar89 = vmulps_avx512vl(auVar75,auVar85);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar74,auVar88);
    auVar65 = vmulps_avx512vl(auVar82,auVar85);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar77,auVar88);
    auVar66 = vmulps_avx512vl(auVar72,auVar85);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar81,auVar88);
    auVar67 = vmulps_avx512vl(auVar79,auVar85);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar78,auVar88);
    auVar68 = vmulps_avx512vl(auVar86,auVar85);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar87,auVar88);
    auVar69 = vmulps_avx512vl(auVar84,auVar85);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar200,auVar88);
    auVar73 = vmulps_avx512vl(auVar70,auVar85);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar80,auVar88);
    auVar85 = vmulps_avx512vl(auVar83,auVar85);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar88);
    auVar88 = vminps_avx512vl(auVar89,auVar65);
    auVar89 = vmaxps_avx512vl(auVar89,auVar65);
    auVar65 = vminps_avx512vl(auVar66,auVar67);
    auVar88 = vminps_avx512vl(auVar88,auVar65);
    auVar65 = vmaxps_avx512vl(auVar66,auVar67);
    auVar89 = vmaxps_avx512vl(auVar89,auVar65);
    auVar65 = vminps_avx512vl(auVar68,auVar69);
    auVar66 = vmaxps_avx512vl(auVar68,auVar69);
    auVar67 = vminps_avx512vl(auVar73,auVar85);
    auVar65 = vminps_avx512vl(auVar65,auVar67);
    auVar88 = vminps_avx512vl(auVar88,auVar65);
    auVar85 = vmaxps_avx512vl(auVar73,auVar85);
    auVar85 = vmaxps_avx512vl(auVar66,auVar85);
    auVar85 = vmaxps_avx512vl(auVar89,auVar85);
    auVar57 = auVar85._0_16_;
    uVar18 = vcmpps_avx512vl(auVar88,local_260,2);
    uVar19 = vcmpps_avx512vl(auVar85,local_280,5);
    bVar24 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar24 != 0) {
      auVar85 = vsubps_avx512vl(auVar78,auVar74);
      auVar88 = vsubps_avx512vl(auVar79,auVar75);
      auVar89 = vsubps_avx512vl(auVar71,auVar87);
      auVar85 = vaddps_avx512vl(auVar85,auVar89);
      auVar57 = auVar85._0_16_;
      auVar89 = vsubps_avx512vl(auVar83,auVar86);
      auVar88 = vaddps_avx512vl(auVar88,auVar89);
      auVar89 = vmulps_avx512vl(auVar75,auVar85);
      auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar88,auVar74);
      auVar82 = vmulps_avx512vl(auVar82,auVar85);
      auVar82 = vfnmadd213ps_avx512vl(auVar77,auVar88,auVar82);
      auVar72 = vmulps_avx512vl(auVar72,auVar85);
      auVar72 = vfnmadd213ps_avx512vl(auVar81,auVar88,auVar72);
      auVar81 = vmulps_avx512vl(auVar79,auVar85);
      auVar79 = vfnmadd231ps_avx512vl(auVar81,auVar88,auVar78);
      auVar81 = vmulps_avx512vl(auVar86,auVar85);
      auVar86 = vfnmadd231ps_avx512vl(auVar81,auVar88,auVar87);
      auVar81 = vmulps_avx512vl(auVar84,auVar85);
      auVar84 = vfnmadd213ps_avx512vl(auVar200,auVar88,auVar81);
      auVar81 = vmulps_avx512vl(auVar70,auVar85);
      auVar87 = vfnmadd213ps_avx512vl(auVar80,auVar88,auVar81);
      auVar80 = vmulps_avx512vl(auVar83,auVar85);
      auVar83 = vfnmadd231ps_avx512vl(auVar80,auVar71,auVar88);
      auVar81 = vminps_avx(auVar89,auVar82);
      auVar80 = vmaxps_avx(auVar89,auVar82);
      auVar78 = vminps_avx(auVar72,auVar79);
      auVar78 = vminps_avx(auVar81,auVar78);
      auVar81 = vmaxps_avx(auVar72,auVar79);
      auVar80 = vmaxps_avx(auVar80,auVar81);
      auVar70 = vminps_avx(auVar86,auVar84);
      auVar81 = vmaxps_avx(auVar86,auVar84);
      auVar71 = vminps_avx(auVar87,auVar83);
      auVar70 = vminps_avx(auVar70,auVar71);
      auVar70 = vminps_avx(auVar78,auVar70);
      auVar78 = vmaxps_avx(auVar87,auVar83);
      auVar81 = vmaxps_avx(auVar81,auVar78);
      auVar80 = vmaxps_avx(auVar80,auVar81);
      uVar18 = vcmpps_avx512vl(auVar80,local_280,5);
      uVar19 = vcmpps_avx512vl(auVar70,local_260,2);
      bVar24 = bVar24 & (byte)uVar18 & (byte)uVar19;
      if (bVar24 != 0) {
        auStack_450[uVar26] = (uint)bVar24;
        uVar18 = vmovlps_avx(auVar40);
        (&uStack_240)[uVar26] = uVar18;
        uVar3 = vmovlps_avx(auVar58);
        auStack_1a0[uVar26] = uVar3;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
    }
    auVar40 = vxorps_avx512vl(auVar57,auVar57);
    auVar244 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar252 = ZEXT1664(auVar40);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT3264(auVar80);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar246 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar247 = ZEXT1664(auVar40);
    auVar248 = ZEXT3264(_DAT_01fb9fe0);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar251 = ZEXT1664(auVar40);
LAB_01b511a2:
    do {
      do {
        do {
          auVar57 = auVar244._0_16_;
          if ((int)uVar26 == 0) {
            uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar23._4_4_ = uVar109;
            auVar23._0_4_ = uVar109;
            auVar23._8_4_ = uVar109;
            auVar23._12_4_ = uVar109;
            auVar23._16_4_ = uVar109;
            auVar23._20_4_ = uVar109;
            auVar23._24_4_ = uVar109;
            auVar23._28_4_ = uVar109;
            uVar18 = vcmpps_avx512vl(local_1c0,auVar23,2);
            uVar32 = (ulong)((uint)uVar32 & (uint)uVar32 + 0xff & (uint)uVar18);
            goto LAB_01b5014c;
          }
          uVar25 = (int)uVar26 - 1;
          uVar27 = (ulong)uVar25;
          uVar8 = auStack_450[uVar27];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auStack_1a0[uVar27];
          uVar3 = 0;
          for (uVar31 = (ulong)uVar8; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar28 = uVar8 - 1 & uVar8;
          bVar35 = uVar28 == 0;
          auStack_450[uVar27] = uVar28;
          if (bVar35) {
            uVar26 = (ulong)uVar25;
          }
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar3;
          auVar40 = vpunpcklqdq_avx(auVar112,ZEXT416((int)uVar3 + 1));
          auVar40 = vcvtqq2ps_avx512vl(auVar40);
          auVar40 = vmulps_avx512vl(auVar40,auVar246._0_16_);
          uVar109 = *(undefined4 *)((long)&uStack_240 + uVar27 * 8 + 4);
          auVar20._4_4_ = uVar109;
          auVar20._0_4_ = uVar109;
          auVar20._8_4_ = uVar109;
          auVar20._12_4_ = uVar109;
          auVar60 = vmulps_avx512vl(auVar40,auVar20);
          auVar41 = auVar247._0_16_;
          auVar40 = vsubps_avx512vl(auVar41,auVar40);
          uVar109 = *(undefined4 *)(&uStack_240 + uVar27);
          auVar21._4_4_ = uVar109;
          auVar21._0_4_ = uVar109;
          auVar21._8_4_ = uVar109;
          auVar21._12_4_ = uVar109;
          auVar40 = vfmadd231ps_avx512vl(auVar60,auVar40,auVar21);
          auVar60 = vmovshdup_avx(auVar40);
          fVar215 = auVar60._0_4_ - auVar40._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          if (uVar8 == 0 || bVar35) goto LAB_01b50ca6;
          auVar60 = vshufps_avx(auVar58,auVar58,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          auVar43 = vsubps_avx512vl(auVar41,auVar60);
          fVar201 = auVar60._0_4_;
          auVar138._0_4_ = fVar201 * fVar129;
          fVar210 = auVar60._4_4_;
          auVar138._4_4_ = fVar210 * fVar135;
          fVar211 = auVar60._8_4_;
          auVar138._8_4_ = fVar211 * fVar129;
          fVar212 = auVar60._12_4_;
          auVar138._12_4_ = fVar212 * fVar135;
          auVar150._0_4_ = fVar201 * fVar136;
          auVar150._4_4_ = fVar210 * fVar146;
          auVar150._8_4_ = fVar211 * fVar136;
          auVar150._12_4_ = fVar212 * fVar146;
          auVar160._0_4_ = fVar201 * fVar148;
          auVar160._4_4_ = fVar210 * fVar156;
          auVar160._8_4_ = fVar211 * fVar148;
          auVar160._12_4_ = fVar212 * fVar156;
          auVar122._0_4_ = fVar201 * fVar157;
          auVar122._4_4_ = fVar210 * fVar165;
          auVar122._8_4_ = fVar211 * fVar157;
          auVar122._12_4_ = fVar212 * fVar165;
          auVar60 = vfmadd231ps_fma(auVar138,auVar43,auVar38);
          auVar44 = vfmadd231ps_fma(auVar150,auVar43,auVar55);
          auVar42 = vfmadd231ps_fma(auVar160,auVar43,auVar52);
          auVar43 = vfmadd231ps_fma(auVar122,auVar43,auVar53);
          auVar133._16_16_ = auVar60;
          auVar133._0_16_ = auVar60;
          auVar143._16_16_ = auVar44;
          auVar143._0_16_ = auVar44;
          auVar155._16_16_ = auVar42;
          auVar155._0_16_ = auVar42;
          auVar81 = vpermps_avx512vl(auVar248._0_32_,ZEXT1632(auVar40));
          auVar80 = vsubps_avx(auVar143,auVar133);
          auVar44 = vfmadd213ps_fma(auVar80,auVar81,auVar133);
          auVar80 = vsubps_avx(auVar155,auVar143);
          auVar45 = vfmadd213ps_fma(auVar80,auVar81,auVar143);
          auVar60 = vsubps_avx(auVar43,auVar42);
          auVar144._16_16_ = auVar60;
          auVar144._0_16_ = auVar60;
          auVar60 = vfmadd213ps_fma(auVar144,auVar81,auVar155);
          auVar80 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar44));
          auVar44 = vfmadd213ps_fma(auVar80,auVar81,ZEXT1632(auVar44));
          auVar80 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar45));
          auVar60 = vfmadd213ps_fma(auVar80,auVar81,ZEXT1632(auVar45));
          auVar80 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar44));
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar80,auVar81);
          auVar80 = vmulps_avx512vl(auVar80,auVar245._0_32_);
          auVar91._16_16_ = auVar80._16_16_;
          auVar60 = vmulss_avx512f(ZEXT416((uint)fVar215),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar201 = auVar60._0_4_;
          auVar161._0_8_ =
               CONCAT44(auVar110._4_4_ + fVar201 * auVar80._4_4_,
                        auVar110._0_4_ + fVar201 * auVar80._0_4_);
          auVar161._8_4_ = auVar110._8_4_ + fVar201 * auVar80._8_4_;
          auVar161._12_4_ = auVar110._12_4_ + fVar201 * auVar80._12_4_;
          auVar139._0_4_ = fVar201 * auVar80._16_4_;
          auVar139._4_4_ = fVar201 * auVar80._20_4_;
          auVar139._8_4_ = fVar201 * auVar80._24_4_;
          auVar139._12_4_ = fVar201 * auVar80._28_4_;
          auVar49 = vsubps_avx((undefined1  [16])0x0,auVar139);
          auVar45 = vshufpd_avx(auVar110,auVar110,3);
          auVar46 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar60 = vsubps_avx(auVar45,auVar110);
          auVar44 = vsubps_avx(auVar46,(undefined1  [16])0x0);
          auVar185._0_4_ = auVar60._0_4_ + auVar44._0_4_;
          auVar185._4_4_ = auVar60._4_4_ + auVar44._4_4_;
          auVar185._8_4_ = auVar60._8_4_ + auVar44._8_4_;
          auVar185._12_4_ = auVar60._12_4_ + auVar44._12_4_;
          auVar60 = vshufps_avx(auVar110,auVar110,0xb1);
          auVar44 = vshufps_avx(auVar161,auVar161,0xb1);
          auVar42 = vshufps_avx(auVar49,auVar49,0xb1);
          auVar43 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar234._4_4_ = auVar185._0_4_;
          auVar234._0_4_ = auVar185._0_4_;
          auVar234._8_4_ = auVar185._0_4_;
          auVar234._12_4_ = auVar185._0_4_;
          auVar47 = vshufps_avx(auVar185,auVar185,0x55);
          fVar201 = auVar47._0_4_;
          auVar196._0_4_ = auVar60._0_4_ * fVar201;
          fVar210 = auVar47._4_4_;
          auVar196._4_4_ = auVar60._4_4_ * fVar210;
          fVar211 = auVar47._8_4_;
          auVar196._8_4_ = auVar60._8_4_ * fVar211;
          fVar212 = auVar47._12_4_;
          auVar196._12_4_ = auVar60._12_4_ * fVar212;
          auVar203._0_4_ = auVar44._0_4_ * fVar201;
          auVar203._4_4_ = auVar44._4_4_ * fVar210;
          auVar203._8_4_ = auVar44._8_4_ * fVar211;
          auVar203._12_4_ = auVar44._12_4_ * fVar212;
          auVar218._0_4_ = auVar42._0_4_ * fVar201;
          auVar218._4_4_ = auVar42._4_4_ * fVar210;
          auVar218._8_4_ = auVar42._8_4_ * fVar211;
          auVar218._12_4_ = auVar42._12_4_ * fVar212;
          auVar186._0_4_ = auVar43._0_4_ * fVar201;
          auVar186._4_4_ = auVar43._4_4_ * fVar210;
          auVar186._8_4_ = auVar43._8_4_ * fVar211;
          auVar186._12_4_ = auVar43._12_4_ * fVar212;
          auVar60 = vfmadd231ps_fma(auVar196,auVar234,auVar110);
          auVar44 = vfmadd231ps_fma(auVar203,auVar234,auVar161);
          auVar50 = vfmadd231ps_fma(auVar218,auVar234,auVar49);
          auVar56 = vfmadd231ps_fma(auVar186,(undefined1  [16])0x0,auVar234);
          auVar47 = vshufpd_avx(auVar60,auVar60,1);
          auVar48 = vshufpd_avx(auVar44,auVar44,1);
          auVar61 = vshufpd_avx512vl(auVar50,auVar50,1);
          auVar62 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar42 = vminss_avx(auVar60,auVar44);
          auVar60 = vmaxss_avx(auVar44,auVar60);
          auVar43 = vminss_avx(auVar50,auVar56);
          auVar44 = vmaxss_avx(auVar56,auVar50);
          auVar42 = vminss_avx(auVar42,auVar43);
          auVar60 = vmaxss_avx(auVar44,auVar60);
          auVar43 = vminss_avx(auVar47,auVar48);
          auVar44 = vmaxss_avx(auVar48,auVar47);
          auVar47 = vminss_avx512f(auVar61,auVar62);
          auVar48 = vmaxss_avx512f(auVar62,auVar61);
          auVar44 = vmaxss_avx(auVar48,auVar44);
          auVar43 = vminss_avx512f(auVar43,auVar47);
          fVar210 = auVar44._0_4_;
          fVar201 = auVar60._0_4_;
          if (auVar42._0_4_ < 0.0001) {
            bVar36 = fVar210 == -0.0001;
            bVar33 = NAN(fVar210);
            if (fVar210 <= -0.0001) goto LAB_01b513d1;
            break;
          }
LAB_01b513d1:
          vucomiss_avx512f(auVar43);
          bVar36 = fVar210 <= -0.0001;
          bVar34 = -0.0001 < fVar201;
          bVar33 = bVar36;
          if (!bVar36) break;
          uVar18 = vcmpps_avx512vl(auVar42,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar19 = vcmpps_avx512vl(auVar43,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar24 = (byte)uVar18 & (byte)uVar19 & 1;
          bVar36 = bVar34 && bVar24 == 0;
          bVar33 = bVar34 && bVar24 == 0;
        } while (!bVar34 || bVar24 != 0);
        vcmpss_avx512f(auVar42,auVar57,1);
        auVar50 = auVar249._0_16_;
        uVar18 = vcmpss_avx512f(auVar60,auVar57,1);
        bVar34 = (bool)((byte)uVar18 & 1);
        auVar91._0_16_ = auVar50;
        iVar37 = auVar249._0_4_;
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar37);
        vucomiss_avx512f(auVar90._0_16_);
        bVar33 = (bool)(!bVar36 | bVar33);
        bVar34 = bVar33 == false;
        auVar93._16_16_ = auVar91._16_16_;
        auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar33 * auVar244._0_4_ + (uint)!bVar33 * 0x7f800000;
        auVar48 = auVar92._0_16_;
        auVar95._16_16_ = auVar91._16_16_;
        auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (uint)bVar33 * auVar244._0_4_ + (uint)!bVar33 * -0x800000;
        auVar47 = auVar94._0_16_;
        uVar18 = vcmpss_avx512f(auVar43,auVar57,1);
        bVar36 = (bool)((byte)uVar18 & 1);
        auVar97._16_16_ = auVar91._16_16_;
        auVar97._0_16_ = auVar50;
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar37);
        vucomiss_avx512f(auVar96._0_16_);
        if ((bVar33) || (bVar34)) {
          auVar43 = vucomiss_avx512f(auVar42);
          if ((bVar33) || (bVar34)) {
            auVar56 = vxorps_avx512vl(auVar42,auVar251._0_16_);
            auVar42 = vsubss_avx512f(auVar43,auVar42);
            auVar42 = vdivss_avx512f(auVar56,auVar42);
            auVar43 = vsubss_avx512f(auVar50,auVar42);
            auVar42 = vfmadd213ss_avx512f(auVar43,auVar57,auVar42);
            auVar43 = auVar42;
          }
          else {
            auVar43 = vxorps_avx512vl(auVar43,auVar43);
            vucomiss_avx512f(auVar43);
            if ((bVar33) || (auVar42 = auVar50, bVar34)) {
              auVar42 = SUB6416(ZEXT464(0xff800000),0);
              auVar43 = ZEXT416(0x7f800000);
            }
          }
          auVar48 = vminss_avx512f(auVar48,auVar43);
          auVar47 = vmaxss_avx(auVar42,auVar47);
        }
        uVar18 = vcmpss_avx512f(auVar44,auVar57,1);
        bVar36 = (bool)((byte)uVar18 & 1);
        fVar211 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar37);
        if ((auVar90._0_4_ != fVar211) || (NAN(auVar90._0_4_) || NAN(fVar211))) {
          if ((fVar210 != fVar201) || (NAN(fVar210) || NAN(fVar201))) {
            auVar60 = vxorps_avx512vl(auVar60,auVar251._0_16_);
            auVar187._0_4_ = auVar60._0_4_ / (fVar210 - fVar201);
            auVar187._4_12_ = auVar60._4_12_;
            auVar60 = vsubss_avx512f(auVar50,auVar187);
            auVar60 = vfmadd213ss_avx512f(auVar60,auVar57,auVar187);
            auVar44 = auVar60;
          }
          else if ((fVar201 != 0.0) ||
                  (auVar60 = auVar50, auVar44 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar201))) {
            auVar60 = SUB6416(ZEXT464(0xff800000),0);
            auVar44 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar48 = vminss_avx(auVar48,auVar44);
          auVar47 = vmaxss_avx(auVar60,auVar47);
        }
        bVar36 = auVar96._0_4_ != fVar211;
        auVar60 = vminss_avx512f(auVar48,auVar50);
        auVar99._16_16_ = auVar91._16_16_;
        auVar99._0_16_ = auVar48;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar36 * auVar60._0_4_ + (uint)!bVar36 * auVar48._0_4_;
        auVar60 = vmaxss_avx512f(auVar50,auVar47);
        auVar101._16_16_ = auVar91._16_16_;
        auVar101._0_16_ = auVar47;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar36 * auVar60._0_4_ + (uint)!bVar36 * auVar47._0_4_;
        auVar60 = vmaxss_avx512f(auVar57,auVar98._0_16_);
        auVar44 = vminss_avx512f(auVar100._0_16_,auVar50);
      } while (auVar44._0_4_ < auVar60._0_4_);
      auVar48 = vmaxss_avx512f(auVar57,ZEXT416((uint)(auVar60._0_4_ + -0.1)));
      auVar56 = vminss_avx512f(ZEXT416((uint)(auVar44._0_4_ + 0.1)),auVar50);
      auVar123._0_8_ = auVar110._0_8_;
      auVar123._8_8_ = auVar123._0_8_;
      auVar204._8_8_ = auVar161._0_8_;
      auVar204._0_8_ = auVar161._0_8_;
      auVar219._8_8_ = auVar49._0_8_;
      auVar219._0_8_ = auVar49._0_8_;
      auVar60 = vshufpd_avx(auVar161,auVar161,3);
      auVar44 = vshufpd_avx(auVar49,auVar49,3);
      auVar42 = vshufps_avx(auVar48,auVar56,0);
      auVar47 = vsubps_avx512vl(auVar41,auVar42);
      fVar201 = auVar42._0_4_;
      auVar151._0_4_ = fVar201 * auVar45._0_4_;
      fVar210 = auVar42._4_4_;
      auVar151._4_4_ = fVar210 * auVar45._4_4_;
      fVar211 = auVar42._8_4_;
      auVar151._8_4_ = fVar211 * auVar45._8_4_;
      fVar212 = auVar42._12_4_;
      auVar151._12_4_ = fVar212 * auVar45._12_4_;
      auVar162._0_4_ = fVar201 * auVar60._0_4_;
      auVar162._4_4_ = fVar210 * auVar60._4_4_;
      auVar162._8_4_ = fVar211 * auVar60._8_4_;
      auVar162._12_4_ = fVar212 * auVar60._12_4_;
      auVar239._0_4_ = auVar44._0_4_ * fVar201;
      auVar239._4_4_ = auVar44._4_4_ * fVar210;
      auVar239._8_4_ = auVar44._8_4_ * fVar211;
      auVar239._12_4_ = auVar44._12_4_ * fVar212;
      auVar140._0_4_ = fVar201 * auVar46._0_4_;
      auVar140._4_4_ = fVar210 * auVar46._4_4_;
      auVar140._8_4_ = fVar211 * auVar46._8_4_;
      auVar140._12_4_ = fVar212 * auVar46._12_4_;
      auVar43 = vfmadd231ps_fma(auVar151,auVar47,auVar123);
      auVar45 = vfmadd231ps_fma(auVar162,auVar47,auVar204);
      auVar46 = vfmadd231ps_fma(auVar239,auVar47,auVar219);
      auVar47 = vfmadd231ps_fma(auVar140,auVar47,ZEXT816(0));
      auVar44 = vsubss_avx512f(auVar50,auVar48);
      auVar60 = vmovshdup_avx(auVar58);
      auVar110 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar48._0_4_)),auVar58,auVar44);
      auVar44 = vsubss_avx512f(auVar50,auVar56);
      auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar56._0_4_)),auVar58,auVar44);
      auVar48 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar215));
      auVar58 = vsubps_avx(auVar45,auVar43);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar44 = vmulps_avx512vl(auVar58,auVar49);
      auVar58 = vsubps_avx(auVar46,auVar45);
      auVar42 = vmulps_avx512vl(auVar58,auVar49);
      auVar58 = vsubps_avx(auVar47,auVar46);
      auVar58 = vmulps_avx512vl(auVar58,auVar49);
      auVar60 = vminps_avx(auVar42,auVar58);
      auVar58 = vmaxps_avx(auVar42,auVar58);
      auVar60 = vminps_avx(auVar44,auVar60);
      auVar58 = vmaxps_avx(auVar44,auVar58);
      auVar44 = vshufpd_avx(auVar60,auVar60,3);
      auVar42 = vshufpd_avx(auVar58,auVar58,3);
      auVar60 = vminps_avx(auVar60,auVar44);
      auVar58 = vmaxps_avx(auVar58,auVar42);
      fVar215 = auVar48._0_4_;
      auVar188._0_4_ = auVar60._0_4_ * fVar215;
      auVar188._4_4_ = auVar60._4_4_ * fVar215;
      auVar188._8_4_ = auVar60._8_4_ * fVar215;
      auVar188._12_4_ = auVar60._12_4_ * fVar215;
      auVar174._0_4_ = fVar215 * auVar58._0_4_;
      auVar174._4_4_ = fVar215 * auVar58._4_4_;
      auVar174._8_4_ = fVar215 * auVar58._8_4_;
      auVar174._12_4_ = fVar215 * auVar58._12_4_;
      auVar48 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar61._0_4_ - auVar110._0_4_)));
      auVar58 = vshufpd_avx(auVar43,auVar43,3);
      auVar60 = vshufpd_avx(auVar45,auVar45,3);
      auVar44 = vshufpd_avx(auVar46,auVar46,3);
      auVar42 = vshufpd_avx(auVar47,auVar47,3);
      auVar58 = vsubps_avx(auVar58,auVar43);
      auVar43 = vsubps_avx(auVar60,auVar45);
      auVar45 = vsubps_avx(auVar44,auVar46);
      auVar42 = vsubps_avx(auVar42,auVar47);
      auVar60 = vminps_avx(auVar58,auVar43);
      auVar58 = vmaxps_avx(auVar58,auVar43);
      auVar44 = vminps_avx(auVar45,auVar42);
      auVar44 = vminps_avx(auVar60,auVar44);
      auVar60 = vmaxps_avx(auVar45,auVar42);
      auVar58 = vmaxps_avx(auVar58,auVar60);
      fVar215 = auVar48._0_4_;
      auVar220._0_4_ = fVar215 * auVar44._0_4_;
      auVar220._4_4_ = fVar215 * auVar44._4_4_;
      auVar220._8_4_ = fVar215 * auVar44._8_4_;
      auVar220._12_4_ = fVar215 * auVar44._12_4_;
      auVar205._0_4_ = fVar215 * auVar58._0_4_;
      auVar205._4_4_ = fVar215 * auVar58._4_4_;
      auVar205._8_4_ = fVar215 * auVar58._8_4_;
      auVar205._12_4_ = fVar215 * auVar58._12_4_;
      auVar42 = vinsertps_avx(auVar40,auVar110,0x10);
      auVar62 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9f90,auVar61);
      auVar118._0_4_ = auVar42._0_4_ + auVar62._0_4_;
      auVar118._4_4_ = auVar42._4_4_ + auVar62._4_4_;
      auVar118._8_4_ = auVar42._8_4_ + auVar62._8_4_;
      auVar118._12_4_ = auVar42._12_4_ + auVar62._12_4_;
      auVar48 = vmulps_avx512vl(auVar118,auVar252._0_16_);
      auVar60 = vshufps_avx(auVar48,auVar48,0x54);
      uVar109 = auVar48._0_4_;
      auVar120._4_4_ = uVar109;
      auVar120._0_4_ = uVar109;
      auVar120._8_4_ = uVar109;
      auVar120._12_4_ = uVar109;
      auVar44 = vfmadd213ps_fma(local_290,auVar120,auVar39);
      auVar43 = vfmadd213ps_fma(local_2a0,auVar120,auVar51);
      auVar45 = vfmadd213ps_fma(local_2b0,auVar120,auVar54);
      auVar58 = vsubps_avx(auVar43,auVar44);
      auVar44 = vfmadd213ps_fma(auVar58,auVar120,auVar44);
      auVar58 = vsubps_avx(auVar45,auVar43);
      auVar58 = vfmadd213ps_fma(auVar58,auVar120,auVar43);
      auVar58 = vsubps_avx(auVar58,auVar44);
      auVar44 = vfmadd231ps_fma(auVar44,auVar58,auVar120);
      auVar46 = vmulps_avx512vl(auVar58,auVar49);
      auVar229._8_8_ = auVar44._0_8_;
      auVar229._0_8_ = auVar44._0_8_;
      auVar58 = vshufpd_avx(auVar44,auVar44,3);
      auVar44 = vshufps_avx(auVar48,auVar48,0x55);
      auVar43 = vsubps_avx(auVar58,auVar229);
      auVar45 = vfmadd231ps_fma(auVar229,auVar44,auVar43);
      auVar240._8_8_ = auVar46._0_8_;
      auVar240._0_8_ = auVar46._0_8_;
      auVar58 = vshufpd_avx(auVar46,auVar46,3);
      auVar58 = vsubps_avx512vl(auVar58,auVar240);
      auVar58 = vfmadd213ps_avx512vl(auVar58,auVar44,auVar240);
      auVar121._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
      auVar121._8_4_ = auVar43._8_4_ ^ 0x80000000;
      auVar121._12_4_ = auVar43._12_4_ ^ 0x80000000;
      auVar44 = vmovshdup_avx512vl(auVar58);
      auVar241._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar241._8_4_ = auVar44._8_4_ ^ 0x80000000;
      auVar241._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar46 = vmovshdup_avx512vl(auVar43);
      auVar47 = vpermt2ps_avx512vl(auVar241,ZEXT416(5),auVar43);
      auVar44 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar43._0_4_)),auVar58,auVar46);
      auVar43 = vpermt2ps_avx512vl(auVar58,SUB6416(ZEXT464(4),0),auVar121);
      auVar141._0_4_ = auVar44._0_4_;
      auVar141._4_4_ = auVar141._0_4_;
      auVar141._8_4_ = auVar141._0_4_;
      auVar141._12_4_ = auVar141._0_4_;
      auVar58 = vdivps_avx(auVar47,auVar141);
      auVar63 = vdivps_avx512vl(auVar43,auVar141);
      fVar215 = auVar45._0_4_;
      auVar44 = vshufps_avx(auVar45,auVar45,0x55);
      auVar230._0_4_ = fVar215 * auVar58._0_4_ + auVar44._0_4_ * auVar63._0_4_;
      auVar230._4_4_ = fVar215 * auVar58._4_4_ + auVar44._4_4_ * auVar63._4_4_;
      auVar230._8_4_ = fVar215 * auVar58._8_4_ + auVar44._8_4_ * auVar63._8_4_;
      auVar230._12_4_ = fVar215 * auVar58._12_4_ + auVar44._12_4_ * auVar63._12_4_;
      auVar49 = vsubps_avx(auVar60,auVar230);
      auVar44 = vmovshdup_avx(auVar58);
      auVar60 = vinsertps_avx(auVar188,auVar220,0x1c);
      auVar242._0_4_ = auVar44._0_4_ * auVar60._0_4_;
      auVar242._4_4_ = auVar44._4_4_ * auVar60._4_4_;
      auVar242._8_4_ = auVar44._8_4_ * auVar60._8_4_;
      auVar242._12_4_ = auVar44._12_4_ * auVar60._12_4_;
      auVar56 = vinsertps_avx512f(auVar174,auVar205,0x1c);
      auVar44 = vmulps_avx512vl(auVar44,auVar56);
      auVar47 = vminps_avx512vl(auVar242,auVar44);
      auVar45 = vmaxps_avx(auVar44,auVar242);
      auVar46 = vmovshdup_avx(auVar63);
      auVar44 = vinsertps_avx(auVar220,auVar188,0x4c);
      auVar221._0_4_ = auVar46._0_4_ * auVar44._0_4_;
      auVar221._4_4_ = auVar46._4_4_ * auVar44._4_4_;
      auVar221._8_4_ = auVar46._8_4_ * auVar44._8_4_;
      auVar221._12_4_ = auVar46._12_4_ * auVar44._12_4_;
      auVar43 = vinsertps_avx(auVar205,auVar174,0x4c);
      auVar206._0_4_ = auVar46._0_4_ * auVar43._0_4_;
      auVar206._4_4_ = auVar46._4_4_ * auVar43._4_4_;
      auVar206._8_4_ = auVar46._8_4_ * auVar43._8_4_;
      auVar206._12_4_ = auVar46._12_4_ * auVar43._12_4_;
      auVar46 = vminps_avx(auVar221,auVar206);
      auVar47 = vaddps_avx512vl(auVar47,auVar46);
      auVar46 = vmaxps_avx(auVar206,auVar221);
      auVar207._0_4_ = auVar45._0_4_ + auVar46._0_4_;
      auVar207._4_4_ = auVar45._4_4_ + auVar46._4_4_;
      auVar207._8_4_ = auVar45._8_4_ + auVar46._8_4_;
      auVar207._12_4_ = auVar45._12_4_ + auVar46._12_4_;
      auVar222._8_8_ = 0x3f80000000000000;
      auVar222._0_8_ = 0x3f80000000000000;
      auVar45 = vsubps_avx(auVar222,auVar207);
      auVar46 = vsubps_avx(auVar222,auVar47);
      auVar47 = vsubps_avx(auVar42,auVar48);
      auVar48 = vsubps_avx(auVar62,auVar48);
      fVar212 = auVar47._0_4_;
      auVar243._0_4_ = fVar212 * auVar45._0_4_;
      fVar213 = auVar47._4_4_;
      auVar243._4_4_ = fVar213 * auVar45._4_4_;
      fVar214 = auVar47._8_4_;
      auVar243._8_4_ = fVar214 * auVar45._8_4_;
      fVar166 = auVar47._12_4_;
      auVar243._12_4_ = fVar166 * auVar45._12_4_;
      auVar64 = vbroadcastss_avx512vl(auVar58);
      auVar60 = vmulps_avx512vl(auVar64,auVar60);
      auVar56 = vmulps_avx512vl(auVar64,auVar56);
      auVar64 = vminps_avx512vl(auVar60,auVar56);
      auVar56 = vmaxps_avx512vl(auVar56,auVar60);
      auVar60 = vbroadcastss_avx512vl(auVar63);
      auVar44 = vmulps_avx512vl(auVar60,auVar44);
      auVar60 = vmulps_avx512vl(auVar60,auVar43);
      auVar43 = vminps_avx512vl(auVar44,auVar60);
      auVar43 = vaddps_avx512vl(auVar64,auVar43);
      auVar47 = vmulps_avx512vl(auVar47,auVar46);
      fVar215 = auVar48._0_4_;
      auVar208._0_4_ = fVar215 * auVar45._0_4_;
      fVar201 = auVar48._4_4_;
      auVar208._4_4_ = fVar201 * auVar45._4_4_;
      fVar210 = auVar48._8_4_;
      auVar208._8_4_ = fVar210 * auVar45._8_4_;
      fVar211 = auVar48._12_4_;
      auVar208._12_4_ = fVar211 * auVar45._12_4_;
      auVar223._0_4_ = fVar215 * auVar46._0_4_;
      auVar223._4_4_ = fVar201 * auVar46._4_4_;
      auVar223._8_4_ = fVar210 * auVar46._8_4_;
      auVar223._12_4_ = fVar211 * auVar46._12_4_;
      auVar60 = vmaxps_avx(auVar60,auVar44);
      auVar175._0_4_ = auVar56._0_4_ + auVar60._0_4_;
      auVar175._4_4_ = auVar56._4_4_ + auVar60._4_4_;
      auVar175._8_4_ = auVar56._8_4_ + auVar60._8_4_;
      auVar175._12_4_ = auVar56._12_4_ + auVar60._12_4_;
      auVar189._8_8_ = 0x3f800000;
      auVar189._0_8_ = 0x3f800000;
      auVar60 = vsubps_avx(auVar189,auVar175);
      auVar44 = vsubps_avx512vl(auVar189,auVar43);
      auVar235._0_4_ = fVar212 * auVar60._0_4_;
      auVar235._4_4_ = fVar213 * auVar60._4_4_;
      auVar235._8_4_ = fVar214 * auVar60._8_4_;
      auVar235._12_4_ = fVar166 * auVar60._12_4_;
      auVar231._0_4_ = fVar212 * auVar44._0_4_;
      auVar231._4_4_ = fVar213 * auVar44._4_4_;
      auVar231._8_4_ = fVar214 * auVar44._8_4_;
      auVar231._12_4_ = fVar166 * auVar44._12_4_;
      auVar176._0_4_ = fVar215 * auVar60._0_4_;
      auVar176._4_4_ = fVar201 * auVar60._4_4_;
      auVar176._8_4_ = fVar210 * auVar60._8_4_;
      auVar176._12_4_ = fVar211 * auVar60._12_4_;
      auVar190._0_4_ = fVar215 * auVar44._0_4_;
      auVar190._4_4_ = fVar201 * auVar44._4_4_;
      auVar190._8_4_ = fVar210 * auVar44._8_4_;
      auVar190._12_4_ = fVar211 * auVar44._12_4_;
      auVar60 = vminps_avx(auVar235,auVar231);
      auVar44 = vminps_avx512vl(auVar176,auVar190);
      auVar43 = vminps_avx512vl(auVar60,auVar44);
      auVar60 = vmaxps_avx(auVar231,auVar235);
      auVar44 = vmaxps_avx(auVar190,auVar176);
      auVar44 = vmaxps_avx(auVar44,auVar60);
      auVar45 = vminps_avx512vl(auVar243,auVar47);
      auVar60 = vminps_avx(auVar208,auVar223);
      auVar60 = vminps_avx(auVar45,auVar60);
      auVar60 = vhaddps_avx(auVar43,auVar60);
      auVar45 = vmaxps_avx512vl(auVar47,auVar243);
      auVar43 = vmaxps_avx(auVar223,auVar208);
      auVar43 = vmaxps_avx(auVar43,auVar45);
      auVar44 = vhaddps_avx(auVar44,auVar43);
      auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
      auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
      auVar177._0_4_ = auVar60._0_4_ + auVar49._0_4_;
      auVar177._4_4_ = auVar60._4_4_ + auVar49._4_4_;
      auVar177._8_4_ = auVar60._8_4_ + auVar49._8_4_;
      auVar177._12_4_ = auVar60._12_4_ + auVar49._12_4_;
      auVar191._0_4_ = auVar44._0_4_ + auVar49._0_4_;
      auVar191._4_4_ = auVar44._4_4_ + auVar49._4_4_;
      auVar191._8_4_ = auVar44._8_4_ + auVar49._8_4_;
      auVar191._12_4_ = auVar44._12_4_ + auVar49._12_4_;
      auVar60 = vmaxps_avx(auVar42,auVar177);
      auVar44 = vminps_avx(auVar191,auVar62);
      uVar3 = vcmpps_avx512vl(auVar44,auVar60,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar191,auVar62,1);
    uVar18 = vcmpps_avx512vl(auVar40,auVar177,1);
    if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar60 = vmovshdup_avx(auVar177);
      bVar24 = auVar110._0_4_ < auVar60._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar26 || uVar8 != 0 && !bVar35) | bVar24) == 1) {
      lVar29 = 0xc9;
      do {
        lVar29 = lVar29 + -1;
        if (lVar29 == 0) goto LAB_01b511a2;
        auVar40 = vsubss_avx512f(auVar50,auVar49);
        fVar210 = auVar40._0_4_;
        fVar215 = fVar210 * fVar210 * fVar210;
        auVar40 = vmulss_avx512f(auVar49,ZEXT416(0x40400000));
        fVar201 = auVar40._0_4_ * fVar210 * fVar210;
        fVar211 = auVar49._0_4_;
        auVar40 = vmulss_avx512f(ZEXT416((uint)(fVar211 * fVar211)),ZEXT416(0x40400000));
        fVar210 = fVar210 * auVar40._0_4_;
        auVar131._4_4_ = fVar215;
        auVar131._0_4_ = fVar215;
        auVar131._8_4_ = fVar215;
        auVar131._12_4_ = fVar215;
        auVar124._4_4_ = fVar201;
        auVar124._0_4_ = fVar201;
        auVar124._8_4_ = fVar201;
        auVar124._12_4_ = fVar201;
        auVar113._4_4_ = fVar210;
        auVar113._0_4_ = fVar210;
        auVar113._8_4_ = fVar210;
        auVar113._12_4_ = fVar210;
        fVar211 = fVar211 * fVar211 * fVar211;
        auVar152._0_4_ = (float)local_2c0._0_4_ * fVar211;
        auVar152._4_4_ = (float)local_2c0._4_4_ * fVar211;
        auVar152._8_4_ = fStack_2b8 * fVar211;
        auVar152._12_4_ = fStack_2b4 * fVar211;
        auVar40 = vfmadd231ps_fma(auVar152,auVar54,auVar113);
        auVar40 = vfmadd231ps_fma(auVar40,auVar51,auVar124);
        auVar40 = vfmadd231ps_fma(auVar40,auVar39,auVar131);
        auVar114._8_8_ = auVar40._0_8_;
        auVar114._0_8_ = auVar40._0_8_;
        auVar40 = vshufpd_avx(auVar40,auVar40,3);
        auVar60 = vshufps_avx(auVar49,auVar49,0x55);
        auVar40 = vsubps_avx(auVar40,auVar114);
        auVar60 = vfmadd213ps_fma(auVar40,auVar60,auVar114);
        fVar215 = auVar60._0_4_;
        auVar40 = vshufps_avx(auVar60,auVar60,0x55);
        auVar115._0_4_ = auVar58._0_4_ * fVar215 + auVar63._0_4_ * auVar40._0_4_;
        auVar115._4_4_ = auVar58._4_4_ * fVar215 + auVar63._4_4_ * auVar40._4_4_;
        auVar115._8_4_ = auVar58._8_4_ * fVar215 + auVar63._8_4_ * auVar40._8_4_;
        auVar115._12_4_ = auVar58._12_4_ * fVar215 + auVar63._12_4_ * auVar40._12_4_;
        auVar49 = vsubps_avx(auVar49,auVar115);
        auVar40 = vandps_avx512vl(auVar60,auVar250._0_16_);
        auVar60 = vprolq_avx512vl(auVar40,0x20);
        auVar40 = vmaxss_avx(auVar60,auVar40);
        bVar35 = auVar40._0_4_ <= (float)local_2d0._0_4_;
      } while ((float)local_2d0._0_4_ <= auVar40._0_4_);
      auVar40 = vucomiss_avx512f(auVar57);
      if (bVar35) {
        auVar58 = vucomiss_avx512f(auVar40);
        auVar249 = ZEXT1664(auVar58);
        if (bVar35) {
          vmovshdup_avx(auVar40);
          auVar58 = vucomiss_avx512f(auVar57);
          if (bVar35) {
            auVar60 = vucomiss_avx512f(auVar58);
            auVar249 = ZEXT1664(auVar60);
            if (bVar35) {
              auVar44 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar49 = vinsertps_avx(auVar44,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar44 = vdpps_avx(auVar49,local_2e0,0x7f);
              auVar42 = vdpps_avx(auVar49,local_2f0,0x7f);
              auVar43 = vdpps_avx(auVar49,local_300,0x7f);
              auVar45 = vdpps_avx(auVar49,local_310,0x7f);
              auVar46 = vdpps_avx(auVar49,local_320,0x7f);
              auVar47 = vdpps_avx(auVar49,local_330,0x7f);
              auVar48 = vdpps_avx(auVar49,local_340,0x7f);
              auVar49 = vdpps_avx(auVar49,local_350,0x7f);
              auVar50 = vsubss_avx512f(auVar60,auVar58);
              fVar211 = auVar58._0_4_;
              auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar46._0_4_)),auVar50,auVar44);
              auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar211)),auVar50,auVar42);
              auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * fVar211)),auVar50,auVar43);
              auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar49._0_4_)),auVar50,auVar45);
              auVar60 = vsubss_avx512f(auVar60,auVar40);
              auVar163._0_4_ = auVar60._0_4_;
              fVar215 = auVar163._0_4_ * auVar163._0_4_ * auVar163._0_4_;
              auVar60 = vmulss_avx512f(auVar40,ZEXT416(0x40400000));
              fVar201 = auVar60._0_4_ * auVar163._0_4_ * auVar163._0_4_;
              local_120 = auVar40._0_4_;
              auVar153._0_4_ = local_120 * local_120;
              auVar153._4_4_ = auVar40._4_4_ * auVar40._4_4_;
              auVar153._8_4_ = auVar40._8_4_ * auVar40._8_4_;
              auVar153._12_4_ = auVar40._12_4_ * auVar40._12_4_;
              auVar60 = vmulss_avx512f(auVar153,ZEXT416(0x40400000));
              fVar210 = auVar163._0_4_ * auVar60._0_4_;
              fVar213 = local_120 * auVar153._0_4_;
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar43._0_4_)),
                                        ZEXT416((uint)fVar210),auVar42);
              auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar201),auVar44);
              auVar58 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar215),auVar58);
              fVar212 = auVar58._0_4_;
              if ((fVar147 <= fVar212) &&
                 (fVar214 = *(float *)(ray + k * 4 + 0x100), fVar212 <= fVar214)) {
                auVar58 = vshufps_avx(auVar40,auVar40,0x55);
                auVar44 = vsubps_avx512vl(auVar41,auVar58);
                fVar166 = auVar58._0_4_;
                auVar197._0_4_ = fVar166 * (float)local_3a0._0_4_;
                fVar182 = auVar58._4_4_;
                auVar197._4_4_ = fVar182 * (float)local_3a0._4_4_;
                fVar183 = auVar58._8_4_;
                auVar197._8_4_ = fVar183 * fStack_398;
                fVar184 = auVar58._12_4_;
                auVar197._12_4_ = fVar184 * fStack_394;
                auVar209._0_4_ = fVar166 * (float)local_3b0._0_4_;
                auVar209._4_4_ = fVar182 * (float)local_3b0._4_4_;
                auVar209._8_4_ = fVar183 * fStack_3a8;
                auVar209._12_4_ = fVar184 * fStack_3a4;
                auVar224._0_4_ = fVar166 * (float)local_3c0._0_4_;
                auVar224._4_4_ = fVar182 * (float)local_3c0._4_4_;
                auVar224._8_4_ = fVar183 * fStack_3b8;
                auVar224._12_4_ = fVar184 * fStack_3b4;
                auVar178._0_4_ = fVar166 * (float)local_3d0._0_4_;
                auVar178._4_4_ = fVar182 * (float)local_3d0._4_4_;
                auVar178._8_4_ = fVar183 * fStack_3c8;
                auVar178._12_4_ = fVar184 * fStack_3c4;
                auVar58 = vfmadd231ps_fma(auVar197,auVar44,local_360);
                auVar60 = vfmadd231ps_fma(auVar209,auVar44,local_370);
                auVar41 = vfmadd231ps_fma(auVar224,auVar44,local_380);
                auVar44 = vfmadd231ps_fma(auVar178,auVar44,local_390);
                auVar58 = vsubps_avx(auVar60,auVar58);
                auVar60 = vsubps_avx(auVar41,auVar60);
                auVar41 = vsubps_avx(auVar44,auVar41);
                auVar225._0_4_ = local_120 * auVar60._0_4_;
                auVar225._4_4_ = local_120 * auVar60._4_4_;
                auVar225._8_4_ = local_120 * auVar60._8_4_;
                auVar225._12_4_ = local_120 * auVar60._12_4_;
                auVar163._4_4_ = auVar163._0_4_;
                auVar163._8_4_ = auVar163._0_4_;
                auVar163._12_4_ = auVar163._0_4_;
                auVar58 = vfmadd231ps_fma(auVar225,auVar163,auVar58);
                auVar179._0_4_ = local_120 * auVar41._0_4_;
                auVar179._4_4_ = local_120 * auVar41._4_4_;
                auVar179._8_4_ = local_120 * auVar41._8_4_;
                auVar179._12_4_ = local_120 * auVar41._12_4_;
                auVar60 = vfmadd231ps_fma(auVar179,auVar163,auVar60);
                auVar180._0_4_ = local_120 * auVar60._0_4_;
                auVar180._4_4_ = local_120 * auVar60._4_4_;
                auVar180._8_4_ = local_120 * auVar60._8_4_;
                auVar180._12_4_ = local_120 * auVar60._12_4_;
                auVar58 = vfmadd231ps_fma(auVar180,auVar163,auVar58);
                auVar22._8_4_ = 0x40400000;
                auVar22._0_8_ = 0x4040000040400000;
                auVar22._12_4_ = 0x40400000;
                auVar58 = vmulps_avx512vl(auVar58,auVar22);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar154._0_4_ = fVar213 * (float)local_410._0_4_;
                  auVar154._4_4_ = fVar213 * (float)local_410._4_4_;
                  auVar154._8_4_ = fVar213 * fStack_408;
                  auVar154._12_4_ = fVar213 * fStack_404;
                  auVar142._4_4_ = fVar210;
                  auVar142._0_4_ = fVar210;
                  auVar142._8_4_ = fVar210;
                  auVar142._12_4_ = fVar210;
                  auVar60 = vfmadd132ps_fma(auVar142,auVar154,local_400);
                  auVar132._4_4_ = fVar201;
                  auVar132._0_4_ = fVar201;
                  auVar132._8_4_ = fVar201;
                  auVar132._12_4_ = fVar201;
                  auVar60 = vfmadd132ps_fma(auVar132,auVar60,local_3f0);
                  auVar125._4_4_ = fVar215;
                  auVar125._0_4_ = fVar215;
                  auVar125._8_4_ = fVar215;
                  auVar125._12_4_ = fVar215;
                  auVar44 = vfmadd132ps_fma(auVar125,auVar60,local_3e0);
                  auVar60 = vshufps_avx(auVar44,auVar44,0xc9);
                  auVar41 = vshufps_avx(auVar58,auVar58,0xc9);
                  auVar126._0_4_ = auVar44._0_4_ * auVar41._0_4_;
                  auVar126._4_4_ = auVar44._4_4_ * auVar41._4_4_;
                  auVar126._8_4_ = auVar44._8_4_ * auVar41._8_4_;
                  auVar126._12_4_ = auVar44._12_4_ * auVar41._12_4_;
                  auVar58 = vfmsub231ps_fma(auVar126,auVar58,auVar60);
                  local_140 = auVar58._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar212;
                    uVar109 = vextractps_avx(auVar58,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar109;
                    uVar109 = vextractps_avx(auVar58,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar109;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar211;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_01b511a2;
                  }
                  auVar134._8_4_ = 1;
                  auVar134._0_8_ = 0x100000001;
                  auVar134._12_4_ = 1;
                  auVar134._16_4_ = 1;
                  auVar134._20_4_ = 1;
                  auVar134._24_4_ = 1;
                  auVar134._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar134,ZEXT1632(auVar40));
                  auVar80 = vpermps_avx2(auVar134,ZEXT1632(auVar58));
                  auVar145._8_4_ = 2;
                  auVar145._0_8_ = 0x200000002;
                  auVar145._12_4_ = 2;
                  auVar145._16_4_ = 2;
                  auVar145._20_4_ = 2;
                  auVar145._24_4_ = 2;
                  auVar145._28_4_ = 2;
                  local_160 = vpermps_avx2(auVar145,ZEXT1632(auVar58));
                  local_180[0] = (RTCHitN)auVar80[0];
                  local_180[1] = (RTCHitN)auVar80[1];
                  local_180[2] = (RTCHitN)auVar80[2];
                  local_180[3] = (RTCHitN)auVar80[3];
                  local_180[4] = (RTCHitN)auVar80[4];
                  local_180[5] = (RTCHitN)auVar80[5];
                  local_180[6] = (RTCHitN)auVar80[6];
                  local_180[7] = (RTCHitN)auVar80[7];
                  local_180[8] = (RTCHitN)auVar80[8];
                  local_180[9] = (RTCHitN)auVar80[9];
                  local_180[10] = (RTCHitN)auVar80[10];
                  local_180[0xb] = (RTCHitN)auVar80[0xb];
                  local_180[0xc] = (RTCHitN)auVar80[0xc];
                  local_180[0xd] = (RTCHitN)auVar80[0xd];
                  local_180[0xe] = (RTCHitN)auVar80[0xe];
                  local_180[0xf] = (RTCHitN)auVar80[0xf];
                  local_180[0x10] = (RTCHitN)auVar80[0x10];
                  local_180[0x11] = (RTCHitN)auVar80[0x11];
                  local_180[0x12] = (RTCHitN)auVar80[0x12];
                  local_180[0x13] = (RTCHitN)auVar80[0x13];
                  local_180[0x14] = (RTCHitN)auVar80[0x14];
                  local_180[0x15] = (RTCHitN)auVar80[0x15];
                  local_180[0x16] = (RTCHitN)auVar80[0x16];
                  local_180[0x17] = (RTCHitN)auVar80[0x17];
                  local_180[0x18] = (RTCHitN)auVar80[0x18];
                  local_180[0x19] = (RTCHitN)auVar80[0x19];
                  local_180[0x1a] = (RTCHitN)auVar80[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar80[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar80[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar80[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar80[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar80[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_200._0_8_;
                  uStack_d8 = local_200._8_8_;
                  uStack_d0 = local_200._16_8_;
                  uStack_c8 = local_200._24_8_;
                  local_c0 = local_1e0;
                  vpcmpeqd_avx2(local_1e0,local_1e0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar212;
                  local_440 = local_220;
                  local_480.valid = (int *)local_440;
                  local_480.geometryUserPtr = pGVar9->userPtr;
                  local_480.context = context->user;
                  local_480.hit = local_180;
                  local_480.N = 8;
                  local_480.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_480);
                    auVar248 = ZEXT3264(_DAT_01fb9fe0);
                    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar247 = ZEXT1664(auVar40);
                    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar246 = ZEXT1664(auVar40);
                    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar245 = ZEXT3264(auVar80);
                    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar251 = ZEXT1664(auVar40);
                    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar250 = ZEXT1664(auVar40);
                    auVar249 = ZEXT464(0x3f800000);
                    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar252 = ZEXT1664(auVar40);
                    auVar40 = vxorps_avx512vl(auVar57,auVar57);
                    auVar244 = ZEXT1664(auVar40);
                  }
                  auVar40 = auVar244._0_16_;
                  if (local_440 != (undefined1  [32])0x0) {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_480);
                      auVar248 = ZEXT3264(_DAT_01fb9fe0);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar247 = ZEXT1664(auVar57);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar246 = ZEXT1664(auVar57);
                      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar245 = ZEXT3264(auVar80);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar251 = ZEXT1664(auVar57);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar250 = ZEXT1664(auVar57);
                      auVar249 = ZEXT464(0x3f800000);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar252 = ZEXT1664(auVar57);
                      auVar40 = vxorps_avx512vl(auVar40,auVar40);
                      auVar244 = ZEXT1664(auVar40);
                    }
                    if (local_440 != (undefined1  [32])0x0) {
                      uVar3 = vptestmd_avx512vl(local_440,local_440);
                      iVar37 = *(int *)(local_480.hit + 4);
                      iVar102 = *(int *)(local_480.hit + 8);
                      iVar103 = *(int *)(local_480.hit + 0xc);
                      iVar104 = *(int *)(local_480.hit + 0x10);
                      iVar105 = *(int *)(local_480.hit + 0x14);
                      iVar106 = *(int *)(local_480.hit + 0x18);
                      iVar107 = *(int *)(local_480.hit + 0x1c);
                      bVar24 = (byte)uVar3;
                      bVar35 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar36 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar33 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar34 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_480.ray + 0x180) =
                           (uint)(bVar24 & 1) * *(int *)local_480.hit |
                           (uint)!(bool)(bVar24 & 1) * *(int *)(local_480.ray + 0x180);
                      *(uint *)(local_480.ray + 0x184) =
                           (uint)bVar35 * iVar37 | (uint)!bVar35 * *(int *)(local_480.ray + 0x184);
                      *(uint *)(local_480.ray + 0x188) =
                           (uint)bVar36 * iVar102 | (uint)!bVar36 * *(int *)(local_480.ray + 0x188);
                      *(uint *)(local_480.ray + 0x18c) =
                           (uint)bVar33 * iVar103 | (uint)!bVar33 * *(int *)(local_480.ray + 0x18c);
                      *(uint *)(local_480.ray + 400) =
                           (uint)bVar34 * iVar104 | (uint)!bVar34 * *(int *)(local_480.ray + 400);
                      *(uint *)(local_480.ray + 0x194) =
                           (uint)bVar15 * iVar105 | (uint)!bVar15 * *(int *)(local_480.ray + 0x194);
                      *(uint *)(local_480.ray + 0x198) =
                           (uint)bVar16 * iVar106 | (uint)!bVar16 * *(int *)(local_480.ray + 0x198);
                      *(uint *)(local_480.ray + 0x19c) =
                           (uint)bVar17 * iVar107 | (uint)!bVar17 * *(int *)(local_480.ray + 0x19c);
                      iVar37 = *(int *)(local_480.hit + 0x24);
                      iVar102 = *(int *)(local_480.hit + 0x28);
                      iVar103 = *(int *)(local_480.hit + 0x2c);
                      iVar104 = *(int *)(local_480.hit + 0x30);
                      iVar105 = *(int *)(local_480.hit + 0x34);
                      iVar106 = *(int *)(local_480.hit + 0x38);
                      iVar107 = *(int *)(local_480.hit + 0x3c);
                      bVar35 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar36 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar33 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar34 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_480.ray + 0x1a0) =
                           (uint)(bVar24 & 1) * *(int *)(local_480.hit + 0x20) |
                           (uint)!(bool)(bVar24 & 1) * *(int *)(local_480.ray + 0x1a0);
                      *(uint *)(local_480.ray + 0x1a4) =
                           (uint)bVar35 * iVar37 | (uint)!bVar35 * *(int *)(local_480.ray + 0x1a4);
                      *(uint *)(local_480.ray + 0x1a8) =
                           (uint)bVar36 * iVar102 | (uint)!bVar36 * *(int *)(local_480.ray + 0x1a8);
                      *(uint *)(local_480.ray + 0x1ac) =
                           (uint)bVar33 * iVar103 | (uint)!bVar33 * *(int *)(local_480.ray + 0x1ac);
                      *(uint *)(local_480.ray + 0x1b0) =
                           (uint)bVar34 * iVar104 | (uint)!bVar34 * *(int *)(local_480.ray + 0x1b0);
                      *(uint *)(local_480.ray + 0x1b4) =
                           (uint)bVar15 * iVar105 | (uint)!bVar15 * *(int *)(local_480.ray + 0x1b4);
                      *(uint *)(local_480.ray + 0x1b8) =
                           (uint)bVar16 * iVar106 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1b8);
                      *(uint *)(local_480.ray + 0x1bc) =
                           (uint)bVar17 * iVar107 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1bc);
                      iVar37 = *(int *)(local_480.hit + 0x44);
                      iVar102 = *(int *)(local_480.hit + 0x48);
                      iVar103 = *(int *)(local_480.hit + 0x4c);
                      iVar104 = *(int *)(local_480.hit + 0x50);
                      iVar105 = *(int *)(local_480.hit + 0x54);
                      iVar106 = *(int *)(local_480.hit + 0x58);
                      iVar107 = *(int *)(local_480.hit + 0x5c);
                      bVar35 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar36 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar33 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar34 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_480.ray + 0x1c0) =
                           (uint)(bVar24 & 1) * *(int *)(local_480.hit + 0x40) |
                           (uint)!(bool)(bVar24 & 1) * *(int *)(local_480.ray + 0x1c0);
                      *(uint *)(local_480.ray + 0x1c4) =
                           (uint)bVar35 * iVar37 | (uint)!bVar35 * *(int *)(local_480.ray + 0x1c4);
                      *(uint *)(local_480.ray + 0x1c8) =
                           (uint)bVar36 * iVar102 | (uint)!bVar36 * *(int *)(local_480.ray + 0x1c8);
                      *(uint *)(local_480.ray + 0x1cc) =
                           (uint)bVar33 * iVar103 | (uint)!bVar33 * *(int *)(local_480.ray + 0x1cc);
                      *(uint *)(local_480.ray + 0x1d0) =
                           (uint)bVar34 * iVar104 | (uint)!bVar34 * *(int *)(local_480.ray + 0x1d0);
                      *(uint *)(local_480.ray + 0x1d4) =
                           (uint)bVar15 * iVar105 | (uint)!bVar15 * *(int *)(local_480.ray + 0x1d4);
                      *(uint *)(local_480.ray + 0x1d8) =
                           (uint)bVar16 * iVar106 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1d8);
                      *(uint *)(local_480.ray + 0x1dc) =
                           (uint)bVar17 * iVar107 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1dc);
                      iVar37 = *(int *)(local_480.hit + 100);
                      iVar102 = *(int *)(local_480.hit + 0x68);
                      iVar103 = *(int *)(local_480.hit + 0x6c);
                      iVar104 = *(int *)(local_480.hit + 0x70);
                      iVar105 = *(int *)(local_480.hit + 0x74);
                      iVar106 = *(int *)(local_480.hit + 0x78);
                      iVar107 = *(int *)(local_480.hit + 0x7c);
                      bVar35 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar36 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar33 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar34 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_480.ray + 0x1e0) =
                           (uint)(bVar24 & 1) * *(int *)(local_480.hit + 0x60) |
                           (uint)!(bool)(bVar24 & 1) * *(int *)(local_480.ray + 0x1e0);
                      *(uint *)(local_480.ray + 0x1e4) =
                           (uint)bVar35 * iVar37 | (uint)!bVar35 * *(int *)(local_480.ray + 0x1e4);
                      *(uint *)(local_480.ray + 0x1e8) =
                           (uint)bVar36 * iVar102 | (uint)!bVar36 * *(int *)(local_480.ray + 0x1e8);
                      *(uint *)(local_480.ray + 0x1ec) =
                           (uint)bVar33 * iVar103 | (uint)!bVar33 * *(int *)(local_480.ray + 0x1ec);
                      *(uint *)(local_480.ray + 0x1f0) =
                           (uint)bVar34 * iVar104 | (uint)!bVar34 * *(int *)(local_480.ray + 0x1f0);
                      *(uint *)(local_480.ray + 500) =
                           (uint)bVar15 * iVar105 | (uint)!bVar15 * *(int *)(local_480.ray + 500);
                      *(uint *)(local_480.ray + 0x1f8) =
                           (uint)bVar16 * iVar106 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1f8);
                      *(uint *)(local_480.ray + 0x1fc) =
                           (uint)bVar17 * iVar107 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1fc);
                      iVar37 = *(int *)(local_480.hit + 0x84);
                      iVar102 = *(int *)(local_480.hit + 0x88);
                      iVar103 = *(int *)(local_480.hit + 0x8c);
                      iVar104 = *(int *)(local_480.hit + 0x90);
                      iVar105 = *(int *)(local_480.hit + 0x94);
                      iVar106 = *(int *)(local_480.hit + 0x98);
                      iVar107 = *(int *)(local_480.hit + 0x9c);
                      bVar35 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar36 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar33 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar34 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_480.ray + 0x200) =
                           (uint)(bVar24 & 1) * *(int *)(local_480.hit + 0x80) |
                           (uint)!(bool)(bVar24 & 1) * *(int *)(local_480.ray + 0x200);
                      *(uint *)(local_480.ray + 0x204) =
                           (uint)bVar35 * iVar37 | (uint)!bVar35 * *(int *)(local_480.ray + 0x204);
                      *(uint *)(local_480.ray + 0x208) =
                           (uint)bVar36 * iVar102 | (uint)!bVar36 * *(int *)(local_480.ray + 0x208);
                      *(uint *)(local_480.ray + 0x20c) =
                           (uint)bVar33 * iVar103 | (uint)!bVar33 * *(int *)(local_480.ray + 0x20c);
                      *(uint *)(local_480.ray + 0x210) =
                           (uint)bVar34 * iVar104 | (uint)!bVar34 * *(int *)(local_480.ray + 0x210);
                      *(uint *)(local_480.ray + 0x214) =
                           (uint)bVar15 * iVar105 | (uint)!bVar15 * *(int *)(local_480.ray + 0x214);
                      *(uint *)(local_480.ray + 0x218) =
                           (uint)bVar16 * iVar106 | (uint)!bVar16 * *(int *)(local_480.ray + 0x218);
                      *(uint *)(local_480.ray + 0x21c) =
                           (uint)bVar17 * iVar107 | (uint)!bVar17 * *(int *)(local_480.ray + 0x21c);
                      auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xa0));
                      *(undefined1 (*) [32])(local_480.ray + 0x220) = auVar80;
                      auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xc0));
                      *(undefined1 (*) [32])(local_480.ray + 0x240) = auVar80;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xe0));
                      *(undefined1 (*) [32])(local_480.ray + 0x260) = auVar80;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0x100));
                      *(undefined1 (*) [32])(local_480.ray + 0x280) = auVar80;
                      goto LAB_01b511a2;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar214;
                }
              }
            }
          }
        }
      }
      goto LAB_01b511a2;
    }
    auVar58 = vinsertps_avx(auVar110,auVar61,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }